

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  long lVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar74;
  byte bVar75;
  float fVar76;
  float fVar77;
  float fVar123;
  float fVar124;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar83 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar84 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar126;
  float fVar129;
  float fVar130;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar131;
  undefined4 uVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  undefined1 auVar137 [32];
  undefined8 uVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  float fVar165;
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  uint local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  
  PVar10 = prim[1];
  uVar69 = (ulong)(byte)PVar10;
  lVar65 = uVar69 * 0x19;
  fVar146 = *(float *)(prim + lVar65 + 0x12);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar81 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar83 = vsubps_avx(auVar22,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar145 = fVar146 * auVar83._0_4_;
  fVar131 = fVar146 * auVar81._0_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar22);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar82);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6);
  auVar95 = vpmovsxbd_avx2(auVar78);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar93 = vcvtdq2ps_avx(auVar95);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar10 * 0xc + uVar69 + 6);
  auVar92 = vpmovsxbd_avx2(auVar6);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar72 = (ulong)(uint)((int)(uVar69 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar72 + uVar69 + 6);
  auVar100 = vpmovsxbd_avx2(auVar8);
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar70 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar87 = vpmovsxbd_avx2(auVar9);
  auVar94 = vcvtdq2ps_avx(auVar87);
  auVar173._4_4_ = fVar131;
  auVar173._0_4_ = fVar131;
  auVar173._8_4_ = fVar131;
  auVar173._12_4_ = fVar131;
  auVar173._16_4_ = fVar131;
  auVar173._20_4_ = fVar131;
  auVar173._24_4_ = fVar131;
  auVar173._28_4_ = fVar131;
  auVar179._8_4_ = 1;
  auVar179._0_8_ = 0x100000001;
  auVar179._12_4_ = 1;
  auVar179._16_4_ = 1;
  auVar179._20_4_ = 1;
  auVar179._24_4_ = 1;
  auVar179._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = ZEXT1632(CONCAT412(fVar146 * auVar81._12_4_,
                               CONCAT48(fVar146 * auVar81._8_4_,
                                        CONCAT44(fVar146 * auVar81._4_4_,fVar131))));
  auVar96 = vpermps_avx2(auVar179,auVar97);
  auVar86 = vpermps_avx512vl(auVar85,auVar97);
  fVar131 = auVar86._0_4_;
  fVar138 = auVar86._4_4_;
  auVar97._4_4_ = fVar138 * auVar89._4_4_;
  auVar97._0_4_ = fVar131 * auVar89._0_4_;
  fVar139 = auVar86._8_4_;
  auVar97._8_4_ = fVar139 * auVar89._8_4_;
  fVar163 = auVar86._12_4_;
  auVar97._12_4_ = fVar163 * auVar89._12_4_;
  fVar165 = auVar86._16_4_;
  auVar97._16_4_ = fVar165 * auVar89._16_4_;
  fVar76 = auVar86._20_4_;
  auVar97._20_4_ = fVar76 * auVar89._20_4_;
  fVar77 = auVar86._24_4_;
  auVar97._24_4_ = fVar77 * auVar89._24_4_;
  auVar97._28_4_ = auVar95._28_4_;
  auVar95._4_4_ = auVar92._4_4_ * fVar138;
  auVar95._0_4_ = auVar92._0_4_ * fVar131;
  auVar95._8_4_ = auVar92._8_4_ * fVar139;
  auVar95._12_4_ = auVar92._12_4_ * fVar163;
  auVar95._16_4_ = auVar92._16_4_ * fVar165;
  auVar95._20_4_ = auVar92._20_4_ * fVar76;
  auVar95._24_4_ = auVar92._24_4_ * fVar77;
  auVar95._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar94._4_4_ * fVar138;
  auVar87._0_4_ = auVar94._0_4_ * fVar131;
  auVar87._8_4_ = auVar94._8_4_ * fVar139;
  auVar87._12_4_ = auVar94._12_4_ * fVar163;
  auVar87._16_4_ = auVar94._16_4_ * fVar165;
  auVar87._20_4_ = auVar94._20_4_ * fVar76;
  auVar87._24_4_ = auVar94._24_4_ * fVar77;
  auVar87._28_4_ = auVar86._28_4_;
  auVar22 = vfmadd231ps_fma(auVar97,auVar96,auVar88);
  auVar80 = vfmadd231ps_fma(auVar95,auVar96,auVar93);
  auVar82 = vfmadd231ps_fma(auVar87,auVar100,auVar96);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar173,auVar91);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar173,auVar90);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar101,auVar173);
  auVar174._4_4_ = fVar145;
  auVar174._0_4_ = fVar145;
  auVar174._8_4_ = fVar145;
  auVar174._12_4_ = fVar145;
  auVar174._16_4_ = fVar145;
  auVar174._20_4_ = fVar145;
  auVar174._24_4_ = fVar145;
  auVar174._28_4_ = fVar145;
  auVar87 = ZEXT1632(CONCAT412(fVar146 * auVar83._12_4_,
                               CONCAT48(fVar146 * auVar83._8_4_,
                                        CONCAT44(fVar146 * auVar83._4_4_,fVar145))));
  auVar95 = vpermps_avx2(auVar179,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar146 = auVar87._0_4_;
  fVar131 = auVar87._4_4_;
  auVar96._4_4_ = fVar131 * auVar89._4_4_;
  auVar96._0_4_ = fVar146 * auVar89._0_4_;
  fVar138 = auVar87._8_4_;
  auVar96._8_4_ = fVar138 * auVar89._8_4_;
  fVar139 = auVar87._12_4_;
  auVar96._12_4_ = fVar139 * auVar89._12_4_;
  fVar163 = auVar87._16_4_;
  auVar96._16_4_ = fVar163 * auVar89._16_4_;
  fVar165 = auVar87._20_4_;
  auVar96._20_4_ = fVar165 * auVar89._20_4_;
  fVar76 = auVar87._24_4_;
  auVar96._24_4_ = fVar76 * auVar89._24_4_;
  auVar96._28_4_ = 1;
  auVar85._4_4_ = auVar92._4_4_ * fVar131;
  auVar85._0_4_ = auVar92._0_4_ * fVar146;
  auVar85._8_4_ = auVar92._8_4_ * fVar138;
  auVar85._12_4_ = auVar92._12_4_ * fVar139;
  auVar85._16_4_ = auVar92._16_4_ * fVar163;
  auVar85._20_4_ = auVar92._20_4_ * fVar165;
  auVar85._24_4_ = auVar92._24_4_ * fVar76;
  auVar85._28_4_ = auVar89._28_4_;
  auVar92._4_4_ = auVar94._4_4_ * fVar131;
  auVar92._0_4_ = auVar94._0_4_ * fVar146;
  auVar92._8_4_ = auVar94._8_4_ * fVar138;
  auVar92._12_4_ = auVar94._12_4_ * fVar139;
  auVar92._16_4_ = auVar94._16_4_ * fVar163;
  auVar92._20_4_ = auVar94._20_4_ * fVar165;
  auVar92._24_4_ = auVar94._24_4_ * fVar76;
  auVar92._28_4_ = auVar87._28_4_;
  auVar79 = vfmadd231ps_fma(auVar96,auVar95,auVar88);
  auVar78 = vfmadd231ps_fma(auVar85,auVar95,auVar93);
  auVar6 = vfmadd231ps_fma(auVar92,auVar95,auVar100);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar174,auVar91);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar174,auVar90);
  auVar166._8_4_ = 0x7fffffff;
  auVar166._0_8_ = 0x7fffffff7fffffff;
  auVar166._12_4_ = 0x7fffffff;
  auVar166._16_4_ = 0x7fffffff;
  auVar166._20_4_ = 0x7fffffff;
  auVar166._24_4_ = 0x7fffffff;
  auVar166._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar174,auVar101);
  auVar91 = vandps_avx(ZEXT1632(auVar22),auVar166);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar14 = (bool)((byte)uVar72 & 1);
  auVar86._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._0_4_;
  bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._4_4_;
  bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._8_4_;
  bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar22._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar80),auVar166);
  uVar72 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar14 = (bool)((byte)uVar72 & 1);
  auVar98._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._0_4_;
  bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._4_4_;
  bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._8_4_;
  bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar80._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar82),auVar166);
  uVar72 = vcmpps_avx512vl(auVar91,auVar164,1);
  bVar14 = (bool)((byte)uVar72 & 1);
  auVar91._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._0_4_;
  bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._4_4_;
  bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._8_4_;
  bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar82._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar90 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
  auVar22 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar98);
  auVar90 = vfnmadd213ps_avx512vl(auVar98,auVar88,auVar89);
  auVar80 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar91);
  auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
  auVar82 = vfmadd132ps_fma(auVar91,auVar88,auVar88);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar79));
  auVar101._4_4_ = auVar22._4_4_ * auVar91._4_4_;
  auVar101._0_4_ = auVar22._0_4_ * auVar91._0_4_;
  auVar101._8_4_ = auVar22._8_4_ * auVar91._8_4_;
  auVar101._12_4_ = auVar22._12_4_ * auVar91._12_4_;
  auVar101._16_4_ = auVar91._16_4_ * 0.0;
  auVar101._20_4_ = auVar91._20_4_ * 0.0;
  auVar101._24_4_ = auVar91._24_4_ * 0.0;
  auVar101._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar79));
  auVar92 = vpbroadcastd_avx512vl();
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar143._0_4_ = auVar22._0_4_ * auVar91._0_4_;
  auVar143._4_4_ = auVar22._4_4_ * auVar91._4_4_;
  auVar143._8_4_ = auVar22._8_4_ * auVar91._8_4_;
  auVar143._12_4_ = auVar22._12_4_ * auVar91._12_4_;
  auVar143._16_4_ = auVar91._16_4_ * 0.0;
  auVar143._20_4_ = auVar91._20_4_ * 0.0;
  auVar143._24_4_ = auVar91._24_4_ * 0.0;
  auVar143._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar10 * 0x10 + uVar69 * -2 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar78));
  auVar100._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar100._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar100._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar100._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar100._16_4_ = auVar91._16_4_ * 0.0;
  auVar100._20_4_ = auVar91._20_4_ * 0.0;
  auVar100._24_4_ = auVar91._24_4_ * 0.0;
  auVar100._28_4_ = auVar91._28_4_;
  auVar91 = vcvtdq2ps_avx(auVar88);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar78));
  auVar141._0_4_ = auVar80._0_4_ * auVar91._0_4_;
  auVar141._4_4_ = auVar80._4_4_ * auVar91._4_4_;
  auVar141._8_4_ = auVar80._8_4_ * auVar91._8_4_;
  auVar141._12_4_ = auVar80._12_4_ * auVar91._12_4_;
  auVar141._16_4_ = auVar91._16_4_ * 0.0;
  auVar141._20_4_ = auVar91._20_4_ * 0.0;
  auVar141._24_4_ = auVar91._24_4_ * 0.0;
  auVar141._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 + uVar69 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar6));
  auVar94._4_4_ = auVar91._4_4_ * auVar82._4_4_;
  auVar94._0_4_ = auVar91._0_4_ * auVar82._0_4_;
  auVar94._8_4_ = auVar91._8_4_ * auVar82._8_4_;
  auVar94._12_4_ = auVar91._12_4_ * auVar82._12_4_;
  auVar94._16_4_ = auVar91._16_4_ * 0.0;
  auVar94._20_4_ = auVar91._20_4_ * 0.0;
  auVar94._24_4_ = auVar91._24_4_ * 0.0;
  auVar94._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar6));
  auVar99._0_4_ = auVar82._0_4_ * auVar91._0_4_;
  auVar99._4_4_ = auVar82._4_4_ * auVar91._4_4_;
  auVar99._8_4_ = auVar82._8_4_ * auVar91._8_4_;
  auVar99._12_4_ = auVar82._12_4_ * auVar91._12_4_;
  auVar99._16_4_ = auVar91._16_4_ * 0.0;
  auVar99._20_4_ = auVar91._20_4_ * 0.0;
  auVar99._24_4_ = auVar91._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar101,auVar143);
  auVar88 = vpminsd_avx2(auVar100,auVar141);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88 = vpminsd_avx2(auVar94,auVar99);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar89._4_4_ = uVar132;
  auVar89._0_4_ = uVar132;
  auVar89._8_4_ = uVar132;
  auVar89._12_4_ = uVar132;
  auVar89._16_4_ = uVar132;
  auVar89._20_4_ = uVar132;
  auVar89._24_4_ = uVar132;
  auVar89._28_4_ = uVar132;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar91,auVar88);
  auVar91 = vpmaxsd_avx2(auVar101,auVar143);
  auVar88 = vpmaxsd_avx2(auVar100,auVar141);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar88 = vpmaxsd_avx2(auVar94,auVar99);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar132;
  auVar90._0_4_ = uVar132;
  auVar90._8_4_ = uVar132;
  auVar90._12_4_ = uVar132;
  auVar90._16_4_ = uVar132;
  auVar90._20_4_ = uVar132;
  auVar90._24_4_ = uVar132;
  auVar90._28_4_ = uVar132;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar93._8_4_ = 0x3f800003;
  auVar93._0_8_ = 0x3f8000033f800003;
  auVar93._12_4_ = 0x3f800003;
  auVar93._16_4_ = 0x3f800003;
  auVar93._20_4_ = 0x3f800003;
  auVar93._24_4_ = 0x3f800003;
  auVar93._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar93);
  uVar23 = vpcmpgtd_avx512vl(auVar92,_DAT_01fe9900);
  uVar140 = vcmpps_avx512vl(local_80,auVar91,2);
  if ((byte)((byte)uVar140 & (byte)uVar23) == 0) {
    bVar75 = 0;
  }
  else {
    uVar72 = (ulong)(byte)((byte)uVar140 & (byte)uVar23);
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar24 = 0;
      for (uVar69 = uVar72; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      local_440._0_4_ = *(undefined4 *)(prim + lVar24 * 4 + 6);
      uVar69 = (ulong)(uint)((int)lVar24 << 6);
      uVar71 = *(uint *)(prim + 2);
      pGVar12 = (context->scene->geometries).items[uVar71].ptr;
      auVar22 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x16);
      if (uVar72 != 0) {
        uVar73 = uVar72 - 1 & uVar72;
        for (uVar70 = uVar72; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
        }
        if (uVar73 != 0) {
          for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_650 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x26);
      local_660 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x36);
      _local_490 = *(undefined1 (*) [16])(prim + uVar69 + lVar65 + 0x46);
      local_5a0._0_8_ = pGVar12;
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar79 = vsubps_avx(auVar22,auVar80);
      uVar132 = auVar79._0_4_;
      auVar81._4_4_ = uVar132;
      auVar81._0_4_ = uVar132;
      auVar81._8_4_ = uVar132;
      auVar81._12_4_ = uVar132;
      auVar82 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar146 = pre->ray_space[k].vz.field_0.m128[0];
      fVar131 = pre->ray_space[k].vz.field_0.m128[1];
      fVar138 = pre->ray_space[k].vz.field_0.m128[2];
      fVar139 = pre->ray_space[k].vz.field_0.m128[3];
      auVar84._0_4_ = fVar146 * auVar79._0_4_;
      auVar84._4_4_ = fVar131 * auVar79._4_4_;
      auVar84._8_4_ = fVar138 * auVar79._8_4_;
      auVar84._12_4_ = fVar139 * auVar79._12_4_;
      auVar82 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar82);
      auVar6 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar81);
      auVar82 = vshufps_avx(auVar22,auVar22,0xff);
      auVar78 = vsubps_avx(local_650,auVar80);
      uVar132 = auVar78._0_4_;
      auVar147._4_4_ = uVar132;
      auVar147._0_4_ = uVar132;
      auVar147._8_4_ = uVar132;
      auVar147._12_4_ = uVar132;
      auVar79 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar168._0_4_ = fVar146 * auVar78._0_4_;
      auVar168._4_4_ = fVar131 * auVar78._4_4_;
      auVar168._8_4_ = fVar138 * auVar78._8_4_;
      auVar168._12_4_ = fVar139 * auVar78._12_4_;
      auVar79 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar79);
      auVar7 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar147);
      auVar78 = vsubps_avx512vl(local_660,auVar80);
      uVar132 = auVar78._0_4_;
      auVar148._4_4_ = uVar132;
      auVar148._0_4_ = uVar132;
      auVar148._8_4_ = uVar132;
      auVar148._12_4_ = uVar132;
      auVar79 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar170._0_4_ = fVar146 * auVar78._0_4_;
      auVar170._4_4_ = fVar131 * auVar78._4_4_;
      auVar170._8_4_ = fVar138 * auVar78._8_4_;
      auVar170._12_4_ = fVar139 * auVar78._12_4_;
      auVar79 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar5,auVar79);
      auVar78 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar148);
      auVar79 = vsubps_avx512vl(_local_490,auVar80);
      uVar132 = auVar79._0_4_;
      auVar83._4_4_ = uVar132;
      auVar83._0_4_ = uVar132;
      auVar83._8_4_ = uVar132;
      auVar83._12_4_ = uVar132;
      auVar80 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar171._0_4_ = fVar146 * auVar79._0_4_;
      auVar171._4_4_ = fVar131 * auVar79._4_4_;
      auVar171._8_4_ = fVar138 * auVar79._8_4_;
      auVar171._12_4_ = fVar139 * auVar79._12_4_;
      auVar80 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar80);
      auVar79 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar83);
      lVar24 = (long)iVar11 * 0x44;
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      local_500 = vbroadcastss_avx512vl(auVar6);
      auVar137._8_4_ = 1;
      auVar137._0_8_ = 0x100000001;
      auVar137._12_4_ = 1;
      auVar137._16_4_ = 1;
      auVar137._20_4_ = 1;
      auVar137._24_4_ = 1;
      auVar137._28_4_ = 1;
      local_540 = vpermps_avx2(auVar137,ZEXT1632(auVar6));
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      local_560 = vbroadcastss_avx512vl(auVar7);
      local_580 = vpermps_avx2(auVar137,ZEXT1632(auVar7));
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      local_680 = vbroadcastss_avx512vl(auVar78);
      local_640 = vpermps_avx512vl(auVar137,ZEXT1632(auVar78));
      auVar188 = ZEXT3264(local_640);
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar79);
      auVar190 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar137,ZEXT1632(auVar79));
      auVar191 = ZEXT3264(local_620);
      auVar93 = vmulps_avx512vl(local_600,auVar90);
      auVar92 = vmulps_avx512vl(local_620,auVar90);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_680);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_640);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_560);
      auVar80 = vfmadd231ps_fma(auVar92,auVar88,local_580);
      auVar94 = vfmadd231ps_avx512vl(auVar93,auVar91,local_500);
      auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar91,local_540);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      auVar87 = vmulps_avx512vl(local_600,auVar100);
      auVar96 = vmulps_avx512vl(local_620,auVar100);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar101,local_680);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_640);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_560);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_580);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_500);
      auVar8 = vfmadd231ps_fma(auVar96,auVar93,local_540);
      auVar96 = vsubps_avx512vl(auVar87,auVar94);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar8),auVar95);
      auVar85 = vmulps_avx512vl(auVar95,auVar96);
      auVar86 = vmulps_avx512vl(auVar94,auVar97);
      auVar85 = vsubps_avx512vl(auVar85,auVar86);
      auVar80 = vshufps_avx(local_650,local_650,0xff);
      uVar140 = auVar82._0_8_;
      local_a0._8_8_ = uVar140;
      local_a0._0_8_ = uVar140;
      local_a0._16_8_ = uVar140;
      local_a0._24_8_ = uVar140;
      local_c0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx512vl(local_660,local_660,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar80);
      auVar80 = vshufps_avx512vl(_local_490,_local_490,0xff);
      uVar140 = auVar80._0_8_;
      register0x000012c8 = uVar140;
      local_100 = uVar140;
      register0x000012d0 = uVar140;
      register0x000012d8 = uVar140;
      auVar86 = vmulps_avx512vl(_local_100,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,local_e0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,local_c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_a0);
      auVar98 = vmulps_avx512vl(_local_100,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_c0);
      auVar9 = vfmadd231ps_fma(auVar98,auVar93,local_a0);
      auVar98 = vmulps_avx512vl(auVar97,auVar97);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar96);
      auVar99 = vmaxps_avx512vl(auVar86,ZEXT1632(auVar9));
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      auVar98 = vmulps_avx512vl(auVar99,auVar98);
      auVar85 = vmulps_avx512vl(auVar85,auVar85);
      uVar140 = vcmpps_avx512vl(auVar85,auVar98,2);
      auVar80 = vblendps_avx(auVar6,auVar22,8);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = vandps_avx512vl(auVar80,auVar81);
      auVar80 = vblendps_avx(auVar7,local_650,8);
      auVar80 = vandps_avx512vl(auVar80,auVar81);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      auVar80 = vblendps_avx(auVar78,local_660,8);
      auVar83 = vandps_avx512vl(auVar80,auVar81);
      auVar80 = vblendps_avx(auVar79,_local_490,8);
      auVar80 = vandps_avx512vl(auVar80,auVar81);
      auVar80 = vmaxps_avx(auVar83,auVar80);
      auVar80 = vmaxps_avx(auVar82,auVar80);
      auVar82 = vmovshdup_avx(auVar80);
      auVar82 = vmaxss_avx(auVar82,auVar80);
      auVar80 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxss_avx(auVar80,auVar82);
      auVar82 = vcvtsi2ss_avx512f(local_660,iVar11);
      local_460._0_16_ = auVar82;
      auVar172._0_4_ = auVar82._0_4_;
      auVar172._4_4_ = auVar172._0_4_;
      auVar172._8_4_ = auVar172._0_4_;
      auVar172._12_4_ = auVar172._0_4_;
      auVar172._16_4_ = auVar172._0_4_;
      auVar172._20_4_ = auVar172._0_4_;
      auVar172._24_4_ = auVar172._0_4_;
      auVar172._28_4_ = auVar172._0_4_;
      uVar23 = vcmpps_avx512vl(auVar172,_DAT_01faff40,0xe);
      bVar75 = (byte)uVar140 & (byte)uVar23;
      local_400 = auVar80._0_4_ * 4.7683716e-07;
      auVar144._8_4_ = 2;
      auVar144._0_8_ = 0x200000002;
      auVar144._12_4_ = 2;
      auVar144._16_4_ = 2;
      auVar144._20_4_ = 2;
      auVar144._24_4_ = 2;
      auVar144._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar144,ZEXT1632(auVar6));
      local_140 = vpermps_avx512vl(auVar144,ZEXT1632(auVar7));
      local_160 = vpermps_avx512vl(auVar144,ZEXT1632(auVar78));
      local_5e0 = vpermps_avx2(auVar144,ZEXT1632(auVar79));
      uVar132 = *(undefined4 *)(ray + k * 4 + 0x60);
      fStack_3fc = 0.0;
      fStack_3f8 = 0.0;
      fStack_3f4 = 0.0;
      auVar80 = auVar97._0_16_;
      if (bVar75 == 0) {
        uVar69 = 0;
        auVar80 = vxorps_avx512vl(auVar80,auVar80);
        auVar187 = ZEXT1664(auVar80);
        auVar184 = ZEXT3264(local_500);
        auVar185 = ZEXT3264(local_540);
        auVar186 = ZEXT3264(local_560);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar189 = ZEXT3264(auVar91);
        auVar183 = ZEXT3264(local_580);
        auVar182 = ZEXT3264(local_680);
      }
      else {
        auVar100 = vmulps_avx512vl(local_5e0,auVar100);
        auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar100);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar101);
        auVar92 = vfmadd213ps_avx512vl(auVar93,local_120,auVar92);
        auVar90 = vmulps_avx512vl(local_5e0,auVar90);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_160,auVar90);
        auVar101 = vfmadd213ps_avx512vl(auVar88,local_140,auVar89);
        auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1f9c);
        auVar101 = vfmadd213ps_avx512vl(auVar91,local_120,auVar101);
        auVar91 = vmulps_avx512vl(local_600,auVar93);
        auVar100 = vmulps_avx512vl(local_620,auVar93);
        auVar93 = vmulps_avx512vl(local_5e0,auVar93);
        auVar82 = vfmadd231ps_fma(auVar91,auVar90,local_680);
        auVar91 = vfmadd231ps_avx512vl(auVar100,auVar90,local_640);
        auVar90 = vfmadd231ps_avx512vl(auVar93,local_160,auVar90);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar89,local_560);
        auVar183 = ZEXT3264(local_580);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_580);
        auVar100 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_500);
        auVar85 = vfmadd231ps_avx512vl(auVar91,auVar88,local_540);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1f9c);
        auVar100 = vfmadd231ps_avx512vl(auVar100,local_120,auVar88);
        auVar88 = vmulps_avx512vl(local_600,auVar90);
        auVar98 = vmulps_avx512vl(local_620,auVar90);
        auVar90 = vmulps_avx512vl(local_5e0,auVar90);
        auVar82 = vfmadd231ps_fma(auVar88,auVar89,local_680);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_640);
        auVar89 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
        auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar88,local_560);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_580);
        auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
        auVar89 = vfmadd231ps_avx512vl(auVar90,auVar91,local_500);
        auVar90 = vfmadd231ps_avx512vl(auVar98,auVar91,local_540);
        auVar98 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
        auVar180._8_4_ = 0x7fffffff;
        auVar180._0_8_ = 0x7fffffff7fffffff;
        auVar180._12_4_ = 0x7fffffff;
        auVar180._16_4_ = 0x7fffffff;
        auVar180._20_4_ = 0x7fffffff;
        auVar180._24_4_ = 0x7fffffff;
        auVar180._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(auVar93,auVar180);
        auVar88 = vandps_avx(auVar85,auVar180);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar100,auVar180);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        auVar100 = vbroadcastss_avx512vl(ZEXT416((uint)local_400));
        uVar69 = vcmpps_avx512vl(auVar91,auVar100,1);
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar102._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar93._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar93._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar93._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar93._12_4_);
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar93._16_4_);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar93._20_4_);
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar93._24_4_);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar102._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar93._28_4_;
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar103._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar85._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar85._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar85._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar85._12_4_);
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar85._16_4_);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar85._20_4_);
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar85._24_4_);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar103._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar85._28_4_;
        auVar91 = vandps_avx(auVar180,auVar89);
        auVar88 = vandps_avx(auVar90,auVar180);
        auVar88 = vmaxps_avx(auVar91,auVar88);
        auVar91 = vandps_avx(auVar98,auVar180);
        auVar91 = vmaxps_avx(auVar88,auVar91);
        uVar69 = vcmpps_avx512vl(auVar91,auVar100,1);
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar104._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar89._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar89._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar89._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar89._12_4_);
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar89._16_4_);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar89._20_4_);
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar89._24_4_);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar104._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar89._28_4_;
        bVar14 = (bool)((byte)uVar69 & 1);
        auVar105._0_4_ = (float)((uint)bVar14 * auVar97._0_4_ | (uint)!bVar14 * auVar90._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar90._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar90._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar90._12_4_);
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar90._16_4_);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar90._20_4_);
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar90._24_4_);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar105._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar90._28_4_;
        auVar84 = vxorps_avx512vl(auVar80,auVar80);
        auVar187 = ZEXT1664(auVar84);
        auVar91 = vfmadd213ps_avx512vl(auVar102,auVar102,ZEXT1632(auVar84));
        auVar80 = vfmadd231ps_fma(auVar91,auVar103,auVar103);
        auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar146 = auVar91._0_4_;
        fVar131 = auVar91._4_4_;
        fVar138 = auVar91._8_4_;
        fVar139 = auVar91._12_4_;
        fVar163 = auVar91._16_4_;
        fVar165 = auVar91._20_4_;
        fVar76 = auVar91._24_4_;
        auVar31._4_4_ = fVar131 * fVar131 * fVar131 * auVar80._4_4_ * -0.5;
        auVar31._0_4_ = fVar146 * fVar146 * fVar146 * auVar80._0_4_ * -0.5;
        auVar31._8_4_ = fVar138 * fVar138 * fVar138 * auVar80._8_4_ * -0.5;
        auVar31._12_4_ = fVar139 * fVar139 * fVar139 * auVar80._12_4_ * -0.5;
        auVar31._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar31._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar31._24_4_ = fVar76 * fVar76 * fVar76 * -0.0;
        auVar31._28_4_ = 0;
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar89 = vfmadd231ps_avx512vl(auVar31,auVar88,auVar91);
        auVar32._4_4_ = auVar103._4_4_ * auVar89._4_4_;
        auVar32._0_4_ = auVar103._0_4_ * auVar89._0_4_;
        auVar32._8_4_ = auVar103._8_4_ * auVar89._8_4_;
        auVar32._12_4_ = auVar103._12_4_ * auVar89._12_4_;
        auVar32._16_4_ = auVar103._16_4_ * auVar89._16_4_;
        auVar32._20_4_ = auVar103._20_4_ * auVar89._20_4_;
        auVar32._24_4_ = auVar103._24_4_ * auVar89._24_4_;
        auVar32._28_4_ = auVar91._28_4_;
        auVar33._4_4_ = auVar89._4_4_ * -auVar102._4_4_;
        auVar33._0_4_ = auVar89._0_4_ * -auVar102._0_4_;
        auVar33._8_4_ = auVar89._8_4_ * -auVar102._8_4_;
        auVar33._12_4_ = auVar89._12_4_ * -auVar102._12_4_;
        auVar33._16_4_ = auVar89._16_4_ * -auVar102._16_4_;
        auVar33._20_4_ = auVar89._20_4_ * -auVar102._20_4_;
        auVar33._24_4_ = auVar89._24_4_ * -auVar102._24_4_;
        auVar33._28_4_ = auVar102._28_4_ ^ 0x80000000;
        auVar91 = vmulps_avx512vl(auVar89,ZEXT1632(auVar84));
        auVar96 = ZEXT1632(auVar84);
        auVar90 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar96);
        auVar80 = vfmadd231ps_fma(auVar90,auVar105,auVar105);
        auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar146 = auVar90._0_4_;
        fVar131 = auVar90._4_4_;
        fVar138 = auVar90._8_4_;
        fVar139 = auVar90._12_4_;
        fVar163 = auVar90._16_4_;
        fVar165 = auVar90._20_4_;
        fVar76 = auVar90._24_4_;
        auVar34._4_4_ = fVar131 * fVar131 * fVar131 * auVar80._4_4_ * -0.5;
        auVar34._0_4_ = fVar146 * fVar146 * fVar146 * auVar80._0_4_ * -0.5;
        auVar34._8_4_ = fVar138 * fVar138 * fVar138 * auVar80._8_4_ * -0.5;
        auVar34._12_4_ = fVar139 * fVar139 * fVar139 * auVar80._12_4_ * -0.5;
        auVar34._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar34._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar34._24_4_ = fVar76 * fVar76 * fVar76 * -0.0;
        auVar34._28_4_ = 0;
        auVar88 = vfmadd231ps_avx512vl(auVar34,auVar88,auVar90);
        auVar35._4_4_ = auVar105._4_4_ * auVar88._4_4_;
        auVar35._0_4_ = auVar105._0_4_ * auVar88._0_4_;
        auVar35._8_4_ = auVar105._8_4_ * auVar88._8_4_;
        auVar35._12_4_ = auVar105._12_4_ * auVar88._12_4_;
        auVar35._16_4_ = auVar105._16_4_ * auVar88._16_4_;
        auVar35._20_4_ = auVar105._20_4_ * auVar88._20_4_;
        auVar35._24_4_ = auVar105._24_4_ * auVar88._24_4_;
        auVar35._28_4_ = auVar90._28_4_;
        auVar36._4_4_ = -auVar104._4_4_ * auVar88._4_4_;
        auVar36._0_4_ = -auVar104._0_4_ * auVar88._0_4_;
        auVar36._8_4_ = -auVar104._8_4_ * auVar88._8_4_;
        auVar36._12_4_ = -auVar104._12_4_ * auVar88._12_4_;
        auVar36._16_4_ = -auVar104._16_4_ * auVar88._16_4_;
        auVar36._20_4_ = -auVar104._20_4_ * auVar88._20_4_;
        auVar36._24_4_ = -auVar104._24_4_ * auVar88._24_4_;
        auVar36._28_4_ = auVar89._28_4_;
        auVar88 = vmulps_avx512vl(auVar88,auVar96);
        auVar80 = vfmadd213ps_fma(auVar32,auVar86,auVar94);
        auVar82 = vfmadd213ps_fma(auVar33,auVar86,auVar95);
        auVar89 = vfmadd213ps_avx512vl(auVar91,auVar86,auVar101);
        auVar90 = vfmadd213ps_avx512vl(auVar35,ZEXT1632(auVar9),auVar87);
        auVar81 = vfnmadd213ps_fma(auVar32,auVar86,auVar94);
        auVar100 = ZEXT1632(auVar9);
        auVar79 = vfmadd213ps_fma(auVar36,auVar100,ZEXT1632(auVar8));
        auVar83 = vfnmadd213ps_fma(auVar33,auVar86,auVar95);
        auVar78 = vfmadd213ps_fma(auVar88,auVar100,auVar92);
        auVar93 = vfnmadd231ps_avx512vl(auVar101,auVar86,auVar91);
        auVar147 = vfnmadd213ps_fma(auVar35,auVar100,auVar87);
        auVar8 = vfnmadd213ps_fma(auVar36,auVar100,ZEXT1632(auVar8));
        auVar148 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar9),auVar88);
        auVar88 = vsubps_avx512vl(auVar90,ZEXT1632(auVar81));
        auVar91 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar83));
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar78),auVar93);
        auVar101 = vmulps_avx512vl(auVar91,auVar93);
        auVar6 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar83),auVar92);
        auVar37._4_4_ = auVar81._4_4_ * auVar92._4_4_;
        auVar37._0_4_ = auVar81._0_4_ * auVar92._0_4_;
        auVar37._8_4_ = auVar81._8_4_ * auVar92._8_4_;
        auVar37._12_4_ = auVar81._12_4_ * auVar92._12_4_;
        auVar37._16_4_ = auVar92._16_4_ * 0.0;
        auVar37._20_4_ = auVar92._20_4_ * 0.0;
        auVar37._24_4_ = auVar92._24_4_ * 0.0;
        auVar37._28_4_ = auVar92._28_4_;
        auVar92 = vfmsub231ps_avx512vl(auVar37,auVar93,auVar88);
        auVar38._4_4_ = auVar83._4_4_ * auVar88._4_4_;
        auVar38._0_4_ = auVar83._0_4_ * auVar88._0_4_;
        auVar38._8_4_ = auVar83._8_4_ * auVar88._8_4_;
        auVar38._12_4_ = auVar83._12_4_ * auVar88._12_4_;
        auVar38._16_4_ = auVar88._16_4_ * 0.0;
        auVar38._20_4_ = auVar88._20_4_ * 0.0;
        auVar38._24_4_ = auVar88._24_4_ * 0.0;
        auVar38._28_4_ = auVar88._28_4_;
        auVar7 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar81),auVar91);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar96,auVar92);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,ZEXT1632(auVar6));
        auVar96 = ZEXT1632(auVar84);
        uVar69 = vcmpps_avx512vl(auVar91,auVar96,2);
        bVar68 = (byte)uVar69;
        fVar76 = (float)((uint)(bVar68 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar147._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar145 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar147._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar124 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar147._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar127 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar147._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar145,fVar76))));
        fVar77 = (float)((uint)(bVar68 & 1) * auVar82._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar8._0_4_);
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        fVar123 = (float)((uint)bVar14 * auVar82._4_4_ | (uint)!bVar14 * auVar8._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        fVar125 = (float)((uint)bVar14 * auVar82._8_4_ | (uint)!bVar14 * auVar8._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        fVar128 = (float)((uint)bVar14 * auVar82._12_4_ | (uint)!bVar14 * auVar8._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar125,CONCAT44(fVar123,fVar77))));
        auVar106._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar148._0_4_
                    );
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar148._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar148._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar148._12_4_);
        fVar146 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar89._16_4_);
        auVar106._16_4_ = fVar146;
        fVar131 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar89._20_4_);
        auVar106._20_4_ = fVar131;
        fVar138 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar89._24_4_);
        auVar106._24_4_ = fVar138;
        iVar1 = (uint)(byte)(uVar69 >> 7) * auVar89._28_4_;
        auVar106._28_4_ = iVar1;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar90);
        auVar107._0_4_ =
             (uint)(bVar68 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar107._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar88._16_4_;
        auVar107._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar88._20_4_;
        auVar107._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar88._24_4_;
        auVar107._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar79));
        auVar108._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar82._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar82._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar82._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar82._12_4_);
        fVar165 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar88._16_4_);
        auVar108._16_4_ = fVar165;
        fVar163 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar88._20_4_);
        auVar108._20_4_ = fVar163;
        fVar139 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar88._24_4_);
        auVar108._24_4_ = fVar139;
        auVar108._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(auVar93,ZEXT1632(auVar78));
        auVar109._0_4_ =
             (float)((uint)(bVar68 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar89._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar89._4_4_);
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar89._8_4_);
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar89._12_4_);
        bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar89._16_4_);
        bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar89._20_4_);
        bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar89._24_4_);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar109._28_4_ = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar89._28_4_;
        auVar110._0_4_ =
             (uint)(bVar68 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar90._0_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar14 * (int)auVar81._4_4_ | (uint)!bVar14 * auVar90._4_4_;
        bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar14 * (int)auVar81._8_4_ | (uint)!bVar14 * auVar90._8_4_;
        bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar14 * (int)auVar81._12_4_ | (uint)!bVar14 * auVar90._12_4_;
        auVar110._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar90._16_4_;
        auVar110._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar90._20_4_;
        auVar110._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar90._24_4_;
        auVar110._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar90._28_4_;
        bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._0_4_ =
             (uint)(bVar68 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar78._0_4_;
        bVar15 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar78._4_4_;
        bVar15 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar78._8_4_;
        bVar15 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar78._12_4_;
        auVar111._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar93._16_4_;
        auVar111._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar93._20_4_;
        auVar111._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar93._24_4_;
        iVar2 = (uint)(byte)(uVar69 >> 7) * auVar93._28_4_;
        auVar111._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar110,auVar101);
        auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar83._12_4_ |
                                                (uint)!bVar17 * auVar79._12_4_,
                                                CONCAT48((uint)bVar16 * (int)auVar83._8_4_ |
                                                         (uint)!bVar16 * auVar79._8_4_,
                                                         CONCAT44((uint)bVar14 * (int)auVar83._4_4_
                                                                  | (uint)!bVar14 * auVar79._4_4_,
                                                                  (uint)(bVar68 & 1) *
                                                                  (int)auVar83._0_4_ |
                                                                  (uint)!(bool)(bVar68 & 1) *
                                                                  auVar79._0_4_)))),auVar100);
        auVar89 = vsubps_avx(auVar111,auVar106);
        auVar90 = vsubps_avx(auVar101,auVar107);
        auVar93 = vsubps_avx(auVar100,auVar108);
        auVar92 = vsubps_avx(auVar106,auVar109);
        auVar39._4_4_ = auVar89._4_4_ * fVar145;
        auVar39._0_4_ = auVar89._0_4_ * fVar76;
        auVar39._8_4_ = auVar89._8_4_ * fVar124;
        auVar39._12_4_ = auVar89._12_4_ * fVar127;
        auVar39._16_4_ = auVar89._16_4_ * 0.0;
        auVar39._20_4_ = auVar89._20_4_ * 0.0;
        auVar39._24_4_ = auVar89._24_4_ * 0.0;
        auVar39._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar39,auVar106,auVar94);
        auVar40._4_4_ = fVar123 * auVar94._4_4_;
        auVar40._0_4_ = fVar77 * auVar94._0_4_;
        auVar40._8_4_ = fVar125 * auVar94._8_4_;
        auVar40._12_4_ = fVar128 * auVar94._12_4_;
        auVar40._16_4_ = auVar94._16_4_ * 0.0;
        auVar40._20_4_ = auVar94._20_4_ * 0.0;
        auVar40._24_4_ = auVar94._24_4_ * 0.0;
        auVar40._28_4_ = auVar91._28_4_;
        auVar82 = vfmsub231ps_fma(auVar40,auVar101,auVar88);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,ZEXT1632(auVar80));
        auVar153._0_4_ = auVar88._0_4_ * auVar106._0_4_;
        auVar153._4_4_ = auVar88._4_4_ * auVar106._4_4_;
        auVar153._8_4_ = auVar88._8_4_ * auVar106._8_4_;
        auVar153._12_4_ = auVar88._12_4_ * auVar106._12_4_;
        auVar153._16_4_ = auVar88._16_4_ * fVar146;
        auVar153._20_4_ = auVar88._20_4_ * fVar131;
        auVar153._24_4_ = auVar88._24_4_ * fVar138;
        auVar153._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar153,auVar100,auVar89);
        auVar95 = vfmadd231ps_avx512vl(auVar91,auVar96,ZEXT1632(auVar80));
        auVar91 = vmulps_avx512vl(auVar92,auVar107);
        auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar109);
        auVar41._4_4_ = auVar93._4_4_ * auVar109._4_4_;
        auVar41._0_4_ = auVar93._0_4_ * auVar109._0_4_;
        auVar41._8_4_ = auVar93._8_4_ * auVar109._8_4_;
        auVar41._12_4_ = auVar93._12_4_ * auVar109._12_4_;
        auVar41._16_4_ = auVar93._16_4_ * auVar109._16_4_;
        auVar41._20_4_ = auVar93._20_4_ * auVar109._20_4_;
        auVar41._24_4_ = auVar93._24_4_ * auVar109._24_4_;
        auVar41._28_4_ = auVar109._28_4_;
        auVar80 = vfmsub231ps_fma(auVar41,auVar108,auVar92);
        auVar154._0_4_ = auVar108._0_4_ * auVar90._0_4_;
        auVar154._4_4_ = auVar108._4_4_ * auVar90._4_4_;
        auVar154._8_4_ = auVar108._8_4_ * auVar90._8_4_;
        auVar154._12_4_ = auVar108._12_4_ * auVar90._12_4_;
        auVar154._16_4_ = fVar165 * auVar90._16_4_;
        auVar154._20_4_ = fVar163 * auVar90._20_4_;
        auVar154._24_4_ = fVar139 * auVar90._24_4_;
        auVar154._28_4_ = 0;
        auVar82 = vfmsub231ps_fma(auVar154,auVar93,auVar107);
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar96,auVar91);
        auVar87 = vfmadd231ps_avx512vl(auVar91,auVar96,ZEXT1632(auVar80));
        auVar91 = vmaxps_avx(auVar95,auVar87);
        uVar140 = vcmpps_avx512vl(auVar91,auVar96,2);
        bVar75 = bVar75 & (byte)uVar140;
        auVar184 = ZEXT3264(local_500);
        auVar185 = ZEXT3264(local_540);
        auVar186 = ZEXT3264(local_560);
        auVar182 = ZEXT3264(local_680);
        if (bVar75 == 0) {
          uVar69 = 0;
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar189 = ZEXT3264(auVar91);
          auVar188 = ZEXT3264(local_640);
          auVar190 = ZEXT3264(local_600);
          auVar191 = ZEXT3264(local_620);
        }
        else {
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar175._4_4_ = uVar3;
          auVar175._0_4_ = uVar3;
          auVar175._8_4_ = uVar3;
          auVar175._12_4_ = uVar3;
          auVar175._16_4_ = uVar3;
          auVar175._20_4_ = uVar3;
          auVar175._24_4_ = uVar3;
          auVar175._28_4_ = uVar3;
          auVar177 = ZEXT3264(auVar175);
          auVar42._4_4_ = auVar92._4_4_ * auVar88._4_4_;
          auVar42._0_4_ = auVar92._0_4_ * auVar88._0_4_;
          auVar42._8_4_ = auVar92._8_4_ * auVar88._8_4_;
          auVar42._12_4_ = auVar92._12_4_ * auVar88._12_4_;
          auVar42._16_4_ = auVar92._16_4_ * auVar88._16_4_;
          auVar42._20_4_ = auVar92._20_4_ * auVar88._20_4_;
          auVar42._24_4_ = auVar92._24_4_ * auVar88._24_4_;
          auVar42._28_4_ = auVar91._28_4_;
          auVar79 = vfmsub231ps_fma(auVar42,auVar93,auVar89);
          auVar43._4_4_ = auVar89._4_4_ * auVar90._4_4_;
          auVar43._0_4_ = auVar89._0_4_ * auVar90._0_4_;
          auVar43._8_4_ = auVar89._8_4_ * auVar90._8_4_;
          auVar43._12_4_ = auVar89._12_4_ * auVar90._12_4_;
          auVar43._16_4_ = auVar89._16_4_ * auVar90._16_4_;
          auVar43._20_4_ = auVar89._20_4_ * auVar90._20_4_;
          auVar43._24_4_ = auVar89._24_4_ * auVar90._24_4_;
          auVar43._28_4_ = auVar89._28_4_;
          auVar82 = vfmsub231ps_fma(auVar43,auVar94,auVar92);
          auVar44._4_4_ = auVar93._4_4_ * auVar94._4_4_;
          auVar44._0_4_ = auVar93._0_4_ * auVar94._0_4_;
          auVar44._8_4_ = auVar93._8_4_ * auVar94._8_4_;
          auVar44._12_4_ = auVar93._12_4_ * auVar94._12_4_;
          auVar44._16_4_ = auVar93._16_4_ * auVar94._16_4_;
          auVar44._20_4_ = auVar93._20_4_ * auVar94._20_4_;
          auVar44._24_4_ = auVar93._24_4_ * auVar94._24_4_;
          auVar44._28_4_ = auVar93._28_4_;
          auVar78 = vfmsub231ps_fma(auVar44,auVar90,auVar88);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar78));
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar79),auVar96);
          auVar88 = vrcp14ps_avx512vl(auVar91);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar189 = ZEXT3264(auVar89);
          auVar90 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar89);
          auVar80 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
          auVar45._4_4_ = auVar78._4_4_ * auVar106._4_4_;
          auVar45._0_4_ = auVar78._0_4_ * auVar106._0_4_;
          auVar45._8_4_ = auVar78._8_4_ * auVar106._8_4_;
          auVar45._12_4_ = auVar78._12_4_ * auVar106._12_4_;
          auVar45._16_4_ = fVar146 * 0.0;
          auVar45._20_4_ = fVar131 * 0.0;
          auVar45._24_4_ = fVar138 * 0.0;
          auVar45._28_4_ = iVar1;
          auVar82 = vfmadd231ps_fma(auVar45,auVar100,ZEXT1632(auVar82));
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar101,ZEXT1632(auVar79));
          fVar146 = auVar80._0_4_;
          fVar131 = auVar80._4_4_;
          fVar138 = auVar80._8_4_;
          fVar139 = auVar80._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar139,
                                         CONCAT48(auVar82._8_4_ * fVar138,
                                                  CONCAT44(auVar82._4_4_ * fVar131,
                                                           auVar82._0_4_ * fVar146))));
          auVar167._4_4_ = uVar132;
          auVar167._0_4_ = uVar132;
          auVar167._8_4_ = uVar132;
          auVar167._12_4_ = uVar132;
          auVar167._16_4_ = uVar132;
          auVar167._20_4_ = uVar132;
          auVar167._24_4_ = uVar132;
          auVar167._28_4_ = uVar132;
          uVar140 = vcmpps_avx512vl(local_3a0,auVar175,2);
          uVar23 = vcmpps_avx512vl(auVar167,local_3a0,2);
          bVar75 = (byte)uVar140 & (byte)uVar23 & bVar75;
          auVar190 = ZEXT3264(local_600);
          auVar191 = ZEXT3264(local_620);
          if (bVar75 == 0) {
            uVar69 = 0;
            auVar188 = ZEXT3264(local_640);
          }
          else {
            uVar140 = vcmpps_avx512vl(auVar91,auVar96,4);
            bVar75 = bVar75 & (byte)uVar140;
            auVar188 = ZEXT3264(local_640);
            if (bVar75 != 0) {
              fVar163 = auVar95._0_4_ * fVar146;
              fVar165 = auVar95._4_4_ * fVar131;
              auVar46._4_4_ = fVar165;
              auVar46._0_4_ = fVar163;
              fVar76 = auVar95._8_4_ * fVar138;
              auVar46._8_4_ = fVar76;
              fVar77 = auVar95._12_4_ * fVar139;
              auVar46._12_4_ = fVar77;
              fVar145 = auVar95._16_4_ * 0.0;
              auVar46._16_4_ = fVar145;
              fVar123 = auVar95._20_4_ * 0.0;
              auVar46._20_4_ = fVar123;
              fVar124 = auVar95._24_4_ * 0.0;
              auVar46._24_4_ = fVar124;
              auVar46._28_4_ = auVar91._28_4_;
              auVar88 = vsubps_avx512vl(auVar89,auVar46);
              local_3e0._0_4_ =
                   (float)((uint)(bVar68 & 1) * (int)fVar163 |
                          (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
              bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
              local_3e0._4_4_ = (float)((uint)bVar14 * (int)fVar165 | (uint)!bVar14 * auVar88._4_4_)
              ;
              bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
              local_3e0._8_4_ = (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar88._8_4_);
              bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
              local_3e0._12_4_ =
                   (float)((uint)bVar14 * (int)fVar77 | (uint)!bVar14 * auVar88._12_4_);
              bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
              local_3e0._16_4_ =
                   (float)((uint)bVar14 * (int)fVar145 | (uint)!bVar14 * auVar88._16_4_);
              bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
              local_3e0._20_4_ =
                   (float)((uint)bVar14 * (int)fVar123 | (uint)!bVar14 * auVar88._20_4_);
              bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
              local_3e0._24_4_ =
                   (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar88._24_4_);
              bVar14 = SUB81(uVar69 >> 7,0);
              local_3e0._28_4_ =
                   (float)((uint)bVar14 * auVar91._28_4_ | (uint)!bVar14 * auVar88._28_4_);
              auVar91 = vsubps_avx(ZEXT1632(auVar9),auVar86);
              auVar80 = vfmadd213ps_fma(auVar91,local_3e0,auVar86);
              uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar26._4_4_ = uVar3;
              auVar26._0_4_ = uVar3;
              auVar26._8_4_ = uVar3;
              auVar26._12_4_ = uVar3;
              auVar26._16_4_ = uVar3;
              auVar26._20_4_ = uVar3;
              auVar26._24_4_ = uVar3;
              auVar26._28_4_ = uVar3;
              auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                           CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                    CONCAT44(auVar80._4_4_ +
                                                                             auVar80._4_4_,
                                                                             auVar80._0_4_ +
                                                                             auVar80._0_4_)))),
                                        auVar26);
              uVar140 = vcmpps_avx512vl(local_3a0,auVar91,6);
              if (((byte)uVar140 & bVar75) != 0) {
                auVar151._0_4_ = auVar87._0_4_ * fVar146;
                auVar151._4_4_ = auVar87._4_4_ * fVar131;
                auVar151._8_4_ = auVar87._8_4_ * fVar138;
                auVar151._12_4_ = auVar87._12_4_ * fVar139;
                auVar151._16_4_ = auVar87._16_4_ * 0.0;
                auVar151._20_4_ = auVar87._20_4_ * 0.0;
                auVar151._24_4_ = auVar87._24_4_ * 0.0;
                auVar151._28_4_ = 0;
                auVar91 = vsubps_avx512vl(auVar89,auVar151);
                auVar112._0_4_ =
                     (uint)(bVar68 & 1) * (int)auVar151._0_4_ |
                     (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
                bVar14 = (bool)((byte)(uVar69 >> 1) & 1);
                auVar112._4_4_ = (uint)bVar14 * (int)auVar151._4_4_ | (uint)!bVar14 * auVar91._4_4_;
                bVar14 = (bool)((byte)(uVar69 >> 2) & 1);
                auVar112._8_4_ = (uint)bVar14 * (int)auVar151._8_4_ | (uint)!bVar14 * auVar91._8_4_;
                bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                auVar112._12_4_ =
                     (uint)bVar14 * (int)auVar151._12_4_ | (uint)!bVar14 * auVar91._12_4_;
                bVar14 = (bool)((byte)(uVar69 >> 4) & 1);
                auVar112._16_4_ =
                     (uint)bVar14 * (int)auVar151._16_4_ | (uint)!bVar14 * auVar91._16_4_;
                bVar14 = (bool)((byte)(uVar69 >> 5) & 1);
                auVar112._20_4_ =
                     (uint)bVar14 * (int)auVar151._20_4_ | (uint)!bVar14 * auVar91._20_4_;
                bVar14 = (bool)((byte)(uVar69 >> 6) & 1);
                auVar112._24_4_ =
                     (uint)bVar14 * (int)auVar151._24_4_ | (uint)!bVar14 * auVar91._24_4_;
                auVar112._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar91._28_4_;
                auVar27._8_4_ = 0x40000000;
                auVar27._0_8_ = 0x4000000040000000;
                auVar27._12_4_ = 0x40000000;
                auVar27._16_4_ = 0x40000000;
                auVar27._20_4_ = 0x40000000;
                auVar27._24_4_ = 0x40000000;
                auVar27._28_4_ = 0x40000000;
                local_3c0 = vfmsub132ps_avx512vl(auVar112,auVar89,auVar27);
                local_380 = 0;
                local_360 = local_650._0_8_;
                uStack_358 = local_650._8_8_;
                local_350 = local_660._0_8_;
                uStack_348 = local_660._8_8_;
                if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar69 = CONCAT71((int7)((ulong)pGVar12 >> 8),1),
                     pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar146 = 1.0 / auVar172._0_4_;
                    local_320[0] = fVar146 * (local_3e0._0_4_ + 0.0);
                    local_320[1] = fVar146 * (local_3e0._4_4_ + 1.0);
                    local_320[2] = fVar146 * (local_3e0._8_4_ + 2.0);
                    local_320[3] = fVar146 * (local_3e0._12_4_ + 3.0);
                    fStack_310 = fVar146 * (local_3e0._16_4_ + 4.0);
                    fStack_30c = fVar146 * (local_3e0._20_4_ + 5.0);
                    fStack_308 = fVar146 * (local_3e0._24_4_ + 6.0);
                    fStack_304 = local_3e0._28_4_ + 7.0;
                    local_300 = local_3c0;
                    local_2e0 = local_3a0;
                    uVar70 = 0;
                    local_480 = (ulong)((byte)uVar140 & bVar75);
                    for (uVar69 = local_480; (uVar69 & 1) == 0;
                        uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                      uVar70 = uVar70 + 1;
                    }
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_4e0 = vpbroadcastd_avx512vl();
                    uVar69 = uVar70;
                    local_520 = auVar175;
                    local_37c = iVar11;
                    local_370 = auVar22;
                    do {
                      auVar79 = auVar187._0_16_;
                      local_220 = local_320[uVar70];
                      local_420 = (uint)uVar70;
                      uStack_41c = (undefined4)(uVar70 >> 0x20);
                      local_200 = *(undefined4 *)(local_300 + uVar70 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar70 * 4)
                      ;
                      local_6b0.context = context->user;
                      fVar131 = 1.0 - local_220;
                      fVar146 = fVar131 * fVar131 * -3.0;
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                ZEXT416((uint)(local_220 * fVar131)),
                                                ZEXT416(0xc0000000));
                      auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar131)),
                                                ZEXT416((uint)(local_220 * local_220)),
                                                ZEXT416(0x40000000));
                      fVar131 = auVar80._0_4_ * 3.0;
                      fVar138 = auVar82._0_4_ * 3.0;
                      fVar139 = local_220 * local_220 * 3.0;
                      auVar159._0_4_ = fVar139 * (float)local_490._0_4_;
                      auVar159._4_4_ = fVar139 * (float)local_490._4_4_;
                      auVar159._8_4_ = fVar139 * fStack_488;
                      auVar159._12_4_ = fVar139 * fStack_484;
                      auVar133._4_4_ = fVar138;
                      auVar133._0_4_ = fVar138;
                      auVar133._8_4_ = fVar138;
                      auVar133._12_4_ = fVar138;
                      auVar80 = vfmadd132ps_fma(auVar133,auVar159,local_660);
                      auVar149._4_4_ = fVar131;
                      auVar149._0_4_ = fVar131;
                      auVar149._8_4_ = fVar131;
                      auVar149._12_4_ = fVar131;
                      auVar80 = vfmadd132ps_fma(auVar149,auVar80,local_650);
                      auVar134._4_4_ = fVar146;
                      auVar134._0_4_ = fVar146;
                      auVar134._8_4_ = fVar146;
                      auVar134._12_4_ = fVar146;
                      auVar80 = vfmadd213ps_fma(auVar134,auVar22,auVar80);
                      local_280 = auVar80._0_4_;
                      auVar155._8_4_ = 1;
                      auVar155._0_8_ = 0x100000001;
                      auVar155._12_4_ = 1;
                      auVar155._16_4_ = 1;
                      auVar155._20_4_ = 1;
                      auVar155._24_4_ = 1;
                      auVar155._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar155,ZEXT1632(auVar80));
                      auVar161._8_4_ = 2;
                      auVar161._0_8_ = 0x200000002;
                      auVar161._12_4_ = 2;
                      auVar161._16_4_ = 2;
                      auVar161._20_4_ = 2;
                      auVar161._24_4_ = 2;
                      auVar161._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar161,ZEXT1632(auVar80));
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_4e0._0_8_;
                      uStack_1d8 = local_4e0._8_8_;
                      uStack_1d0 = local_4e0._16_8_;
                      uStack_1c8 = local_4e0._24_8_;
                      local_1c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_1a0 = (local_6b0.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_6b0.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_5c0 = local_2a0;
                      local_6b0.valid = (int *)local_5c0;
                      local_6b0.geometryUserPtr = *(void **)(local_5a0._0_8_ + 0x18);
                      local_6b0.hit = (RTCHitN *)&local_280;
                      local_6b0.N = 8;
                      local_6b0.ray = (RTCRayN *)ray;
                      if (*(code **)(local_5a0._0_8_ + 0x48) != (code *)0x0) {
                        (**(code **)(local_5a0._0_8_ + 0x48))(&local_6b0);
                        auVar177 = ZEXT3264(local_520);
                        auVar191 = ZEXT3264(local_620);
                        auVar190 = ZEXT3264(local_600);
                        auVar188 = ZEXT3264(local_640);
                        auVar182 = ZEXT3264(local_680);
                        auVar183 = ZEXT3264(local_580);
                        auVar186 = ZEXT3264(local_560);
                        auVar185 = ZEXT3264(local_540);
                        auVar184 = ZEXT3264(local_500);
                        auVar80 = vxorps_avx512vl(auVar79,auVar79);
                        auVar187 = ZEXT1664(auVar80);
                      }
                      auVar80 = auVar187._0_16_;
                      if (local_5c0 == (undefined1  [32])0x0) {
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar189 = ZEXT3264(auVar91);
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar91);
                        }
                        else {
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar91);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var13)(&local_6b0);
                            auVar177 = ZEXT3264(local_520);
                            auVar191 = ZEXT3264(local_620);
                            auVar190 = ZEXT3264(local_600);
                            auVar188 = ZEXT3264(local_640);
                            auVar182 = ZEXT3264(local_680);
                            auVar183 = ZEXT3264(local_580);
                            auVar186 = ZEXT3264(local_560);
                            auVar185 = ZEXT3264(local_540);
                            auVar184 = ZEXT3264(local_500);
                            auVar80 = vxorps_avx512vl(auVar80,auVar80);
                            auVar187 = ZEXT1664(auVar80);
                            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar189 = ZEXT3264(auVar91);
                          }
                        }
                        uVar70 = vptestmd_avx512vl(local_5c0,local_5c0);
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar14 = (bool)((byte)uVar70 & 1);
                        bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
                        bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
                        bVar18 = (bool)((byte)(uVar70 >> 4) & 1);
                        bVar19 = (bool)((byte)(uVar70 >> 5) & 1);
                        bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                        bVar21 = SUB81(uVar70 >> 7,0);
                        *(uint *)(local_6b0.ray + 0x100) =
                             (uint)bVar14 * auVar91._0_4_ |
                             (uint)!bVar14 * *(int *)(local_6b0.ray + 0x100);
                        *(uint *)(local_6b0.ray + 0x104) =
                             (uint)bVar15 * auVar91._4_4_ |
                             (uint)!bVar15 * *(int *)(local_6b0.ray + 0x104);
                        *(uint *)(local_6b0.ray + 0x108) =
                             (uint)bVar16 * auVar91._8_4_ |
                             (uint)!bVar16 * *(int *)(local_6b0.ray + 0x108);
                        *(uint *)(local_6b0.ray + 0x10c) =
                             (uint)bVar17 * auVar91._12_4_ |
                             (uint)!bVar17 * *(int *)(local_6b0.ray + 0x10c);
                        *(uint *)(local_6b0.ray + 0x110) =
                             (uint)bVar18 * auVar91._16_4_ |
                             (uint)!bVar18 * *(int *)(local_6b0.ray + 0x110);
                        *(uint *)(local_6b0.ray + 0x114) =
                             (uint)bVar19 * auVar91._20_4_ |
                             (uint)!bVar19 * *(int *)(local_6b0.ray + 0x114);
                        *(uint *)(local_6b0.ray + 0x118) =
                             (uint)bVar20 * auVar91._24_4_ |
                             (uint)!bVar20 * *(int *)(local_6b0.ray + 0x118);
                        *(uint *)(local_6b0.ray + 0x11c) =
                             (uint)bVar21 * auVar91._28_4_ |
                             (uint)!bVar21 * *(int *)(local_6b0.ray + 0x11c);
                        if (local_5c0 != (undefined1  [32])0x0) {
                          uVar69 = CONCAT71((int7)(uVar69 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar177._0_4_;
                      uVar69 = 0;
                      uVar70 = 0;
                      local_480 = local_480 ^ 1L << ((ulong)local_420 & 0x3f);
                      for (uVar73 = local_480; (uVar73 & 1) == 0;
                          uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        uVar70 = uVar70 + 1;
                      }
                    } while (local_480 != 0);
                  }
                  goto LAB_01c89b97;
                }
              }
            }
            uVar69 = 0;
          }
        }
      }
LAB_01c89b97:
      if (8 < iVar11) {
        local_5a0 = vpbroadcastd_avx512vl();
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        fStack_3f0 = local_400;
        fStack_3ec = local_400;
        fStack_3e8 = local_400;
        fStack_3e4 = local_400;
        fStack_478 = 1.0 / (float)local_460._0_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar74 = 8;
        fStack_474 = fStack_478;
        fStack_470 = fStack_478;
        fStack_46c = fStack_478;
        fStack_468 = fStack_478;
        fStack_464 = fStack_478;
        local_420 = uVar132;
        uStack_41c = uVar132;
        uStack_418 = uVar132;
        uStack_414 = uVar132;
        uStack_410 = uVar132;
        uStack_40c = uVar132;
        uStack_408 = uVar132;
        uStack_404 = uVar132;
        local_480._0_4_ = fStack_478;
        local_480._4_4_ = fStack_478;
        do {
          auVar91 = vpbroadcastd_avx512vl();
          auVar93 = vpor_avx2(auVar91,_DAT_01fe9900);
          uVar23 = vpcmpd_avx512vl(auVar93,local_5a0,1);
          auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar74 * 4 + lVar24);
          auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21aa768 + lVar74 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21aabec + lVar74 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21ab070 + lVar74 * 4);
          local_600 = auVar190._0_32_;
          auVar92 = vmulps_avx512vl(local_600,auVar90);
          local_620 = auVar191._0_32_;
          auVar101 = vmulps_avx512vl(local_620,auVar90);
          auVar47._4_4_ = auVar90._4_4_ * (float)local_100._4_4_;
          auVar47._0_4_ = auVar90._0_4_ * (float)local_100._0_4_;
          auVar47._8_4_ = auVar90._8_4_ * fStack_f8;
          auVar47._12_4_ = auVar90._12_4_ * fStack_f4;
          auVar47._16_4_ = auVar90._16_4_ * fStack_f0;
          auVar47._20_4_ = auVar90._20_4_ * fStack_ec;
          auVar47._24_4_ = auVar90._24_4_ * fStack_e8;
          auVar47._28_4_ = auVar93._28_4_;
          auVar141 = auVar182._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar141);
          local_640 = auVar188._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar101,auVar89,local_640);
          auVar101 = vfmadd231ps_avx512vl(auVar47,auVar89,local_e0);
          auVar166 = auVar186._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar166);
          auVar143 = auVar183._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar143);
          auVar80 = vfmadd231ps_fma(auVar101,auVar88,local_c0);
          local_500 = auVar184._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar93,auVar91,local_500);
          auVar164 = auVar185._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar164);
          auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar74 * 4 + lVar24);
          auVar92 = *(undefined1 (*) [32])(lVar24 + 0x21acb88 + lVar74 * 4);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar91,local_a0);
          auVar101 = *(undefined1 (*) [32])(lVar24 + 0x21ad00c + lVar74 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar24 + 0x21ad490 + lVar74 * 4);
          auVar94 = vmulps_avx512vl(local_600,auVar100);
          auVar95 = vmulps_avx512vl(local_620,auVar100);
          auVar48._4_4_ = auVar100._4_4_ * (float)local_100._4_4_;
          auVar48._0_4_ = auVar100._0_4_ * (float)local_100._0_4_;
          auVar48._8_4_ = auVar100._8_4_ * fStack_f8;
          auVar48._12_4_ = auVar100._12_4_ * fStack_f4;
          auVar48._16_4_ = auVar100._16_4_ * fStack_f0;
          auVar48._20_4_ = auVar100._20_4_ * fStack_ec;
          auVar48._24_4_ = auVar100._24_4_ * fStack_e8;
          auVar48._28_4_ = uStack_e4;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar141);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_640);
          auVar97 = vfmadd231ps_avx512vl(auVar48,auVar101,local_e0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar166);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar143);
          auVar82 = vfmadd231ps_fma(auVar97,auVar92,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar94,auVar93,local_500);
          auVar85 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar164);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar93,local_a0);
          auVar86 = vmaxps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar82));
          auVar94 = vsubps_avx(auVar97,auVar87);
          auVar95 = vsubps_avx(auVar85,auVar96);
          auVar98 = vmulps_avx512vl(auVar96,auVar94);
          auVar99 = vmulps_avx512vl(auVar87,auVar95);
          auVar98 = vsubps_avx512vl(auVar98,auVar99);
          auVar99 = vmulps_avx512vl(auVar95,auVar95);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,auVar94);
          auVar86 = vmulps_avx512vl(auVar86,auVar86);
          auVar86 = vmulps_avx512vl(auVar86,auVar99);
          auVar98 = vmulps_avx512vl(auVar98,auVar98);
          uVar140 = vcmpps_avx512vl(auVar98,auVar86,2);
          bVar75 = (byte)uVar23 & (byte)uVar140;
          if (bVar75 == 0) {
            auVar177 = ZEXT3264(auVar143);
            auVar182 = ZEXT3264(auVar141);
          }
          else {
            auVar100 = vmulps_avx512vl(local_5e0,auVar100);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_160,auVar100);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_140,auVar101);
            auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar92);
            auVar90 = vmulps_avx512vl(local_5e0,auVar90);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_160,auVar90);
            auVar88 = vfmadd213ps_avx512vl(auVar88,local_140,auVar89);
            auVar92 = vfmadd213ps_avx512vl(auVar91,local_120,auVar88);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21ab4f4 + lVar74 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21ab978 + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21abdfc + lVar74 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar24 + 0x21ac280 + lVar74 * 4);
            auVar101 = vmulps_avx512vl(local_600,auVar90);
            auVar100 = vmulps_avx512vl(local_620,auVar90);
            auVar90 = vmulps_avx512vl(local_5e0,auVar90);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar141);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,local_640);
            auVar89 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
            auVar90 = vfmadd231ps_avx512vl(auVar101,auVar88,auVar166);
            auVar101 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar143);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,local_500);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar164);
            auVar100 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar24 + 0x21ad914 + lVar74 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21ae21c + lVar74 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar24 + 0x21ae6a0 + lVar74 * 4);
            auVar86 = vmulps_avx512vl(local_600,auVar89);
            auVar98 = vmulps_avx512vl(local_620,auVar89);
            auVar89 = vmulps_avx512vl(local_5e0,auVar89);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar141);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_640);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_160,auVar88);
            auVar88 = *(undefined1 (*) [32])(lVar24 + 0x21add98 + lVar74 * 4);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar88,auVar166);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar143);
            auVar88 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
            auVar89 = vfmadd231ps_avx512vl(auVar86,auVar91,local_500);
            auVar86 = vfmadd231ps_avx512vl(auVar98,auVar91,auVar164);
            auVar88 = vfmadd231ps_avx512vl(auVar88,local_120,auVar91);
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar90,auVar98);
            vandps_avx512vl(auVar101,auVar98);
            auVar91 = vmaxps_avx(auVar98,auVar98);
            vandps_avx512vl(auVar100,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar98);
            auVar67._4_4_ = fStack_3fc;
            auVar67._0_4_ = local_400;
            auVar67._8_4_ = fStack_3f8;
            auVar67._12_4_ = fStack_3f4;
            auVar67._16_4_ = fStack_3f0;
            auVar67._20_4_ = fStack_3ec;
            auVar67._24_4_ = fStack_3e8;
            auVar67._28_4_ = fStack_3e4;
            uVar70 = vcmpps_avx512vl(auVar91,auVar67,1);
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar113._0_4_ = (float)((uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar90._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar90._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar90._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar90._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar90._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar90._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar90._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar113._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar90._28_4_;
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar114._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar101._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar101._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar101._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar101._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar101._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar101._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar101._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar114._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar101._28_4_;
            vandps_avx512vl(auVar89,auVar98);
            vandps_avx512vl(auVar86,auVar98);
            auVar91 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar88,auVar98);
            auVar91 = vmaxps_avx(auVar91,auVar114);
            uVar70 = vcmpps_avx512vl(auVar91,auVar67,1);
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar115._0_4_ = (uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar89._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar89._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar89._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar89._12_4_;
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar115._16_4_ = (uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar89._16_4_;
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar115._20_4_ = (uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar89._20_4_;
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar115._24_4_ = (uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar89._24_4_;
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar115._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar89._28_4_;
            bVar14 = (bool)((byte)uVar70 & 1);
            auVar116._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar86._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar86._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar86._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar86._12_4_);
            bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar86._16_4_);
            bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar86._20_4_);
            bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar86._24_4_);
            bVar14 = SUB81(uVar70 >> 7,0);
            auVar116._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar86._28_4_;
            auVar169._8_4_ = 0x80000000;
            auVar169._0_8_ = 0x8000000080000000;
            auVar169._12_4_ = 0x80000000;
            auVar169._16_4_ = 0x80000000;
            auVar169._20_4_ = 0x80000000;
            auVar169._24_4_ = 0x80000000;
            auVar169._28_4_ = 0x80000000;
            auVar91 = vxorps_avx512vl(auVar115,auVar169);
            auVar86 = auVar187._0_32_;
            auVar88 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar86);
            auVar79 = vfmadd231ps_fma(auVar88,auVar114,auVar114);
            auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
            auVar181._8_4_ = 0xbf000000;
            auVar181._0_8_ = 0xbf000000bf000000;
            auVar181._12_4_ = 0xbf000000;
            auVar181._16_4_ = 0xbf000000;
            auVar181._20_4_ = 0xbf000000;
            auVar181._24_4_ = 0xbf000000;
            auVar181._28_4_ = 0xbf000000;
            fVar146 = auVar88._0_4_;
            fVar131 = auVar88._4_4_;
            fVar138 = auVar88._8_4_;
            fVar139 = auVar88._12_4_;
            fVar163 = auVar88._16_4_;
            fVar165 = auVar88._20_4_;
            fVar76 = auVar88._24_4_;
            auVar49._4_4_ = fVar131 * fVar131 * fVar131 * auVar79._4_4_ * -0.5;
            auVar49._0_4_ = fVar146 * fVar146 * fVar146 * auVar79._0_4_ * -0.5;
            auVar49._8_4_ = fVar138 * fVar138 * fVar138 * auVar79._8_4_ * -0.5;
            auVar49._12_4_ = fVar139 * fVar139 * fVar139 * auVar79._12_4_ * -0.5;
            auVar49._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar49._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar49._24_4_ = fVar76 * fVar76 * fVar76 * -0.0;
            auVar49._28_4_ = auVar114._28_4_;
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar88 = vfmadd231ps_avx512vl(auVar49,auVar89,auVar88);
            auVar50._4_4_ = auVar114._4_4_ * auVar88._4_4_;
            auVar50._0_4_ = auVar114._0_4_ * auVar88._0_4_;
            auVar50._8_4_ = auVar114._8_4_ * auVar88._8_4_;
            auVar50._12_4_ = auVar114._12_4_ * auVar88._12_4_;
            auVar50._16_4_ = auVar114._16_4_ * auVar88._16_4_;
            auVar50._20_4_ = auVar114._20_4_ * auVar88._20_4_;
            auVar50._24_4_ = auVar114._24_4_ * auVar88._24_4_;
            auVar50._28_4_ = 0;
            auVar51._4_4_ = auVar88._4_4_ * -auVar113._4_4_;
            auVar51._0_4_ = auVar88._0_4_ * -auVar113._0_4_;
            auVar51._8_4_ = auVar88._8_4_ * -auVar113._8_4_;
            auVar51._12_4_ = auVar88._12_4_ * -auVar113._12_4_;
            auVar51._16_4_ = auVar88._16_4_ * -auVar113._16_4_;
            auVar51._20_4_ = auVar88._20_4_ * -auVar113._20_4_;
            auVar51._24_4_ = auVar88._24_4_ * -auVar113._24_4_;
            auVar51._28_4_ = auVar114._28_4_;
            auVar90 = vmulps_avx512vl(auVar88,auVar86);
            auVar88 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar86);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar116,auVar116);
            auVar101 = vrsqrt14ps_avx512vl(auVar88);
            auVar88 = vmulps_avx512vl(auVar88,auVar181);
            fVar146 = auVar101._0_4_;
            fVar131 = auVar101._4_4_;
            fVar138 = auVar101._8_4_;
            fVar139 = auVar101._12_4_;
            fVar163 = auVar101._16_4_;
            fVar165 = auVar101._20_4_;
            fVar76 = auVar101._24_4_;
            auVar52._4_4_ = fVar131 * fVar131 * fVar131 * auVar88._4_4_;
            auVar52._0_4_ = fVar146 * fVar146 * fVar146 * auVar88._0_4_;
            auVar52._8_4_ = fVar138 * fVar138 * fVar138 * auVar88._8_4_;
            auVar52._12_4_ = fVar139 * fVar139 * fVar139 * auVar88._12_4_;
            auVar52._16_4_ = fVar163 * fVar163 * fVar163 * auVar88._16_4_;
            auVar52._20_4_ = fVar165 * fVar165 * fVar165 * auVar88._20_4_;
            auVar52._24_4_ = fVar76 * fVar76 * fVar76 * auVar88._24_4_;
            auVar52._28_4_ = auVar88._28_4_;
            auVar88 = vfmadd231ps_avx512vl(auVar52,auVar89,auVar101);
            auVar53._4_4_ = auVar116._4_4_ * auVar88._4_4_;
            auVar53._0_4_ = auVar116._0_4_ * auVar88._0_4_;
            auVar53._8_4_ = auVar116._8_4_ * auVar88._8_4_;
            auVar53._12_4_ = auVar116._12_4_ * auVar88._12_4_;
            auVar53._16_4_ = auVar116._16_4_ * auVar88._16_4_;
            auVar53._20_4_ = auVar116._20_4_ * auVar88._20_4_;
            auVar53._24_4_ = auVar116._24_4_ * auVar88._24_4_;
            auVar53._28_4_ = auVar101._28_4_;
            auVar54._4_4_ = auVar88._4_4_ * auVar91._4_4_;
            auVar54._0_4_ = auVar88._0_4_ * auVar91._0_4_;
            auVar54._8_4_ = auVar88._8_4_ * auVar91._8_4_;
            auVar54._12_4_ = auVar88._12_4_ * auVar91._12_4_;
            auVar54._16_4_ = auVar88._16_4_ * auVar91._16_4_;
            auVar54._20_4_ = auVar88._20_4_ * auVar91._20_4_;
            auVar54._24_4_ = auVar88._24_4_ * auVar91._24_4_;
            auVar54._28_4_ = auVar91._28_4_;
            auVar91 = vmulps_avx512vl(auVar88,auVar86);
            auVar79 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar80),auVar87);
            auVar88 = ZEXT1632(auVar80);
            auVar78 = vfmadd213ps_fma(auVar51,auVar88,auVar96);
            auVar89 = vfmadd213ps_avx512vl(auVar90,auVar88,auVar92);
            auVar101 = vfmadd213ps_avx512vl(auVar53,ZEXT1632(auVar82),auVar97);
            auVar81 = vfnmadd213ps_fma(auVar50,auVar88,auVar87);
            auVar100 = ZEXT1632(auVar82);
            auVar6 = vfmadd213ps_fma(auVar54,auVar100,auVar85);
            auVar83 = vfnmadd213ps_fma(auVar51,auVar88,auVar96);
            auVar7 = vfmadd213ps_fma(auVar91,auVar100,auVar93);
            auVar96 = ZEXT1632(auVar80);
            auVar84 = vfnmadd231ps_fma(auVar92,auVar96,auVar90);
            auVar147 = vfnmadd213ps_fma(auVar53,auVar100,auVar97);
            auVar148 = vfnmadd213ps_fma(auVar54,auVar100,auVar85);
            auVar168 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar82),auVar91);
            auVar93 = vsubps_avx512vl(auVar101,ZEXT1632(auVar81));
            auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar83));
            auVar88 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar84));
            auVar55._4_4_ = auVar91._4_4_ * auVar84._4_4_;
            auVar55._0_4_ = auVar91._0_4_ * auVar84._0_4_;
            auVar55._8_4_ = auVar91._8_4_ * auVar84._8_4_;
            auVar55._12_4_ = auVar91._12_4_ * auVar84._12_4_;
            auVar55._16_4_ = auVar91._16_4_ * 0.0;
            auVar55._20_4_ = auVar91._20_4_ * 0.0;
            auVar55._24_4_ = auVar91._24_4_ * 0.0;
            auVar55._28_4_ = auVar90._28_4_;
            auVar80 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar83),auVar88);
            auVar56._4_4_ = auVar88._4_4_ * auVar81._4_4_;
            auVar56._0_4_ = auVar88._0_4_ * auVar81._0_4_;
            auVar56._8_4_ = auVar88._8_4_ * auVar81._8_4_;
            auVar56._12_4_ = auVar88._12_4_ * auVar81._12_4_;
            auVar56._16_4_ = auVar88._16_4_ * 0.0;
            auVar56._20_4_ = auVar88._20_4_ * 0.0;
            auVar56._24_4_ = auVar88._24_4_ * 0.0;
            auVar56._28_4_ = auVar88._28_4_;
            auVar8 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar84),auVar93);
            auVar57._4_4_ = auVar83._4_4_ * auVar93._4_4_;
            auVar57._0_4_ = auVar83._0_4_ * auVar93._0_4_;
            auVar57._8_4_ = auVar83._8_4_ * auVar93._8_4_;
            auVar57._12_4_ = auVar83._12_4_ * auVar93._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * 0.0;
            auVar57._20_4_ = auVar93._20_4_ * 0.0;
            auVar57._24_4_ = auVar93._24_4_ * 0.0;
            auVar57._28_4_ = auVar93._28_4_;
            auVar9 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar81),auVar91);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar86,ZEXT1632(auVar8));
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar80));
            uVar70 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar68 = (byte)uVar70;
            fVar123 = (float)((uint)(bVar68 & 1) * auVar79._0_4_ |
                             (uint)!(bool)(bVar68 & 1) * auVar147._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar125 = (float)((uint)bVar14 * auVar79._4_4_ | (uint)!bVar14 * auVar147._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar128 = (float)((uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * auVar147._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar129 = (float)((uint)bVar14 * auVar79._12_4_ | (uint)!bVar14 * auVar147._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar128,CONCAT44(fVar125,fVar123))));
            fVar124 = (float)((uint)(bVar68 & 1) * auVar78._0_4_ |
                             (uint)!(bool)(bVar68 & 1) * auVar148._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            fVar127 = (float)((uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar148._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            fVar126 = (float)((uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar148._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            fVar130 = (float)((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar148._12_4_);
            auVar94 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar126,CONCAT44(fVar127,fVar124))));
            auVar117._0_4_ =
                 (float)((uint)(bVar68 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar168._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar168._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar168._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar168._12_4_);
            fVar138 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar89._16_4_);
            auVar117._16_4_ = fVar138;
            fVar131 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar89._20_4_);
            auVar117._20_4_ = fVar131;
            fVar146 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar89._24_4_);
            auVar117._24_4_ = fVar146;
            iVar1 = (uint)(byte)(uVar70 >> 7) * auVar89._28_4_;
            auVar117._28_4_ = iVar1;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar101);
            auVar118._0_4_ =
                 (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar80._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar80._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar80._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar80._12_4_;
            auVar118._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_;
            auVar118._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_;
            auVar118._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_;
            auVar118._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar6));
            auVar119._0_4_ =
                 (float)((uint)(bVar68 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar79._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar79._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar79._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar79._12_4_);
            fVar165 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_);
            auVar119._16_4_ = fVar165;
            fVar163 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_);
            auVar119._20_4_ = fVar163;
            fVar139 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_);
            auVar119._24_4_ = fVar139;
            auVar119._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
            auVar91 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar7));
            auVar120._0_4_ =
                 (float)((uint)(bVar68 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar68 & 1) * auVar78._0_4_);
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar78._4_4_);
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar78._8_4_);
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar78._12_4_);
            fVar76 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar91._16_4_);
            auVar120._16_4_ = fVar76;
            fVar145 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar91._20_4_);
            auVar120._20_4_ = fVar145;
            fVar77 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar91._24_4_);
            auVar120._24_4_ = fVar77;
            iVar2 = (uint)(byte)(uVar70 >> 7) * auVar91._28_4_;
            auVar120._28_4_ = iVar2;
            auVar121._0_4_ =
                 (uint)(bVar68 & 1) * (int)auVar81._0_4_ |
                 (uint)!(bool)(bVar68 & 1) * auVar101._0_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar14 * (int)auVar81._4_4_ | (uint)!bVar14 * auVar101._4_4_;
            bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar14 * (int)auVar81._8_4_ | (uint)!bVar14 * auVar101._8_4_;
            bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar14 * (int)auVar81._12_4_ | (uint)!bVar14 * auVar101._12_4_;
            auVar121._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar101._16_4_;
            auVar121._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar101._20_4_;
            auVar121._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar101._24_4_;
            auVar121._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar101._28_4_;
            bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
            auVar101 = vsubps_avx512vl(auVar121,auVar100);
            auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar83._12_4_ |
                                                    (uint)!bVar18 * auVar6._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar83._8_4_ |
                                                             (uint)!bVar16 * auVar6._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar83._4_4_ |
                                                                      (uint)!bVar14 * auVar6._4_4_,
                                                                      (uint)(bVar68 & 1) *
                                                                      (int)auVar83._0_4_ |
                                                                      (uint)!(bool)(bVar68 & 1) *
                                                                      auVar6._0_4_)))),auVar94);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar84._12_4_ |
                                                    (uint)!bVar19 * auVar7._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar84._8_4_ |
                                                             (uint)!bVar17 * auVar7._8_4_,
                                                             CONCAT44((uint)bVar15 *
                                                                      (int)auVar84._4_4_ |
                                                                      (uint)!bVar15 * auVar7._4_4_,
                                                                      (uint)(bVar68 & 1) *
                                                                      (int)auVar84._0_4_ |
                                                                      (uint)!(bool)(bVar68 & 1) *
                                                                      auVar7._0_4_)))),auVar117);
            auVar90 = vsubps_avx(auVar100,auVar118);
            auVar93 = vsubps_avx(auVar94,auVar119);
            auVar92 = vsubps_avx(auVar117,auVar120);
            auVar58._4_4_ = auVar89._4_4_ * fVar125;
            auVar58._0_4_ = auVar89._0_4_ * fVar123;
            auVar58._8_4_ = auVar89._8_4_ * fVar128;
            auVar58._12_4_ = auVar89._12_4_ * fVar129;
            auVar58._16_4_ = auVar89._16_4_ * 0.0;
            auVar58._20_4_ = auVar89._20_4_ * 0.0;
            auVar58._24_4_ = auVar89._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar58,auVar117,auVar101);
            auVar152._0_4_ = fVar124 * auVar101._0_4_;
            auVar152._4_4_ = fVar127 * auVar101._4_4_;
            auVar152._8_4_ = fVar126 * auVar101._8_4_;
            auVar152._12_4_ = fVar130 * auVar101._12_4_;
            auVar152._16_4_ = auVar101._16_4_ * 0.0;
            auVar152._20_4_ = auVar101._20_4_ * 0.0;
            auVar152._24_4_ = auVar101._24_4_ * 0.0;
            auVar152._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar152,auVar100,auVar88);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar86,ZEXT1632(auVar80));
            auVar156._0_4_ = auVar88._0_4_ * auVar117._0_4_;
            auVar156._4_4_ = auVar88._4_4_ * auVar117._4_4_;
            auVar156._8_4_ = auVar88._8_4_ * auVar117._8_4_;
            auVar156._12_4_ = auVar88._12_4_ * auVar117._12_4_;
            auVar156._16_4_ = auVar88._16_4_ * fVar138;
            auVar156._20_4_ = auVar88._20_4_ * fVar131;
            auVar156._24_4_ = auVar88._24_4_ * fVar146;
            auVar156._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar156,auVar94,auVar89);
            auVar95 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar80));
            auVar91 = vmulps_avx512vl(auVar92,auVar118);
            auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar120);
            auVar59._4_4_ = auVar93._4_4_ * auVar120._4_4_;
            auVar59._0_4_ = auVar93._0_4_ * auVar120._0_4_;
            auVar59._8_4_ = auVar93._8_4_ * auVar120._8_4_;
            auVar59._12_4_ = auVar93._12_4_ * auVar120._12_4_;
            auVar59._16_4_ = auVar93._16_4_ * fVar76;
            auVar59._20_4_ = auVar93._20_4_ * fVar145;
            auVar59._24_4_ = auVar93._24_4_ * fVar77;
            auVar59._28_4_ = iVar2;
            auVar80 = vfmsub231ps_fma(auVar59,auVar119,auVar92);
            auVar157._0_4_ = auVar119._0_4_ * auVar90._0_4_;
            auVar157._4_4_ = auVar119._4_4_ * auVar90._4_4_;
            auVar157._8_4_ = auVar119._8_4_ * auVar90._8_4_;
            auVar157._12_4_ = auVar119._12_4_ * auVar90._12_4_;
            auVar157._16_4_ = fVar165 * auVar90._16_4_;
            auVar157._20_4_ = fVar163 * auVar90._20_4_;
            auVar157._24_4_ = fVar139 * auVar90._24_4_;
            auVar157._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar157,auVar93,auVar118);
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar86,auVar91);
            auVar87 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar80));
            auVar91 = vmaxps_avx(auVar95,auVar87);
            uVar140 = vcmpps_avx512vl(auVar91,auVar86,2);
            bVar75 = bVar75 & (byte)uVar140;
            auVar177 = ZEXT3264(auVar143);
            if (bVar75 != 0) {
              uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar176._4_4_ = uVar132;
              auVar176._0_4_ = uVar132;
              auVar176._8_4_ = uVar132;
              auVar176._12_4_ = uVar132;
              auVar176._16_4_ = uVar132;
              auVar176._20_4_ = uVar132;
              auVar176._24_4_ = uVar132;
              auVar176._28_4_ = uVar132;
              auVar178 = ZEXT3264(auVar176);
              auVar60._4_4_ = auVar92._4_4_ * auVar88._4_4_;
              auVar60._0_4_ = auVar92._0_4_ * auVar88._0_4_;
              auVar60._8_4_ = auVar92._8_4_ * auVar88._8_4_;
              auVar60._12_4_ = auVar92._12_4_ * auVar88._12_4_;
              auVar60._16_4_ = auVar92._16_4_ * auVar88._16_4_;
              auVar60._20_4_ = auVar92._20_4_ * auVar88._20_4_;
              auVar60._24_4_ = auVar92._24_4_ * auVar88._24_4_;
              auVar60._28_4_ = auVar91._28_4_;
              auVar78 = vfmsub231ps_fma(auVar60,auVar93,auVar89);
              auVar61._4_4_ = auVar89._4_4_ * auVar90._4_4_;
              auVar61._0_4_ = auVar89._0_4_ * auVar90._0_4_;
              auVar61._8_4_ = auVar89._8_4_ * auVar90._8_4_;
              auVar61._12_4_ = auVar89._12_4_ * auVar90._12_4_;
              auVar61._16_4_ = auVar89._16_4_ * auVar90._16_4_;
              auVar61._20_4_ = auVar89._20_4_ * auVar90._20_4_;
              auVar61._24_4_ = auVar89._24_4_ * auVar90._24_4_;
              auVar61._28_4_ = auVar89._28_4_;
              auVar79 = vfmsub231ps_fma(auVar61,auVar101,auVar92);
              auVar62._4_4_ = auVar93._4_4_ * auVar101._4_4_;
              auVar62._0_4_ = auVar93._0_4_ * auVar101._0_4_;
              auVar62._8_4_ = auVar93._8_4_ * auVar101._8_4_;
              auVar62._12_4_ = auVar93._12_4_ * auVar101._12_4_;
              auVar62._16_4_ = auVar93._16_4_ * auVar101._16_4_;
              auVar62._20_4_ = auVar93._20_4_ * auVar101._20_4_;
              auVar62._24_4_ = auVar93._24_4_ * auVar101._24_4_;
              auVar62._28_4_ = auVar93._28_4_;
              auVar6 = vfmsub231ps_fma(auVar62,auVar90,auVar88);
              auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar6));
              auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar78),auVar86);
              auVar88 = vrcp14ps_avx512vl(auVar91);
              auVar90 = auVar189._0_32_;
              auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar90);
              auVar80 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
              auVar63._4_4_ = auVar6._4_4_ * auVar117._4_4_;
              auVar63._0_4_ = auVar6._0_4_ * auVar117._0_4_;
              auVar63._8_4_ = auVar6._8_4_ * auVar117._8_4_;
              auVar63._12_4_ = auVar6._12_4_ * auVar117._12_4_;
              auVar63._16_4_ = fVar138 * 0.0;
              auVar63._20_4_ = fVar131 * 0.0;
              auVar63._24_4_ = fVar146 * 0.0;
              auVar63._28_4_ = iVar1;
              auVar79 = vfmadd231ps_fma(auVar63,auVar94,ZEXT1632(auVar79));
              auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar100,ZEXT1632(auVar78));
              fVar146 = auVar80._0_4_;
              fVar131 = auVar80._4_4_;
              fVar138 = auVar80._8_4_;
              fVar139 = auVar80._12_4_;
              local_3a0 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar139,
                                             CONCAT48(auVar79._8_4_ * fVar138,
                                                      CONCAT44(auVar79._4_4_ * fVar131,
                                                               auVar79._0_4_ * fVar146))));
              uVar140 = vcmpps_avx512vl(local_3a0,auVar176,2);
              auVar66._4_4_ = uStack_41c;
              auVar66._0_4_ = local_420;
              auVar66._8_4_ = uStack_418;
              auVar66._12_4_ = uStack_414;
              auVar66._16_4_ = uStack_410;
              auVar66._20_4_ = uStack_40c;
              auVar66._24_4_ = uStack_408;
              auVar66._28_4_ = uStack_404;
              uVar23 = vcmpps_avx512vl(local_3a0,auVar66,0xd);
              bVar75 = (byte)uVar140 & (byte)uVar23 & bVar75;
              if (bVar75 != 0) {
                uVar140 = vcmpps_avx512vl(auVar91,auVar86,4);
                bVar75 = bVar75 & (byte)uVar140;
                auVar182 = ZEXT3264(local_680);
                if (bVar75 != 0) {
                  fVar163 = auVar95._0_4_ * fVar146;
                  fVar165 = auVar95._4_4_ * fVar131;
                  auVar64._4_4_ = fVar165;
                  auVar64._0_4_ = fVar163;
                  fVar76 = auVar95._8_4_ * fVar138;
                  auVar64._8_4_ = fVar76;
                  fVar77 = auVar95._12_4_ * fVar139;
                  auVar64._12_4_ = fVar77;
                  fVar145 = auVar95._16_4_ * 0.0;
                  auVar64._16_4_ = fVar145;
                  fVar123 = auVar95._20_4_ * 0.0;
                  auVar64._20_4_ = fVar123;
                  fVar124 = auVar95._24_4_ * 0.0;
                  auVar64._24_4_ = fVar124;
                  auVar64._28_4_ = auVar91._28_4_;
                  auVar88 = vsubps_avx512vl(auVar90,auVar64);
                  local_3e0._0_4_ =
                       (float)((uint)(bVar68 & 1) * (int)fVar163 |
                              (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
                  local_3e0._4_4_ =
                       (float)((uint)bVar14 * (int)fVar165 | (uint)!bVar14 * auVar88._4_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
                  local_3e0._8_4_ =
                       (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar88._8_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                  local_3e0._12_4_ =
                       (float)((uint)bVar14 * (int)fVar77 | (uint)!bVar14 * auVar88._12_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                  local_3e0._16_4_ =
                       (float)((uint)bVar14 * (int)fVar145 | (uint)!bVar14 * auVar88._16_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
                  local_3e0._20_4_ =
                       (float)((uint)bVar14 * (int)fVar123 | (uint)!bVar14 * auVar88._20_4_);
                  bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                  local_3e0._24_4_ =
                       (float)((uint)bVar14 * (int)fVar124 | (uint)!bVar14 * auVar88._24_4_);
                  bVar14 = SUB81(uVar70 >> 7,0);
                  local_3e0._28_4_ =
                       (float)((uint)bVar14 * auVar91._28_4_ | (uint)!bVar14 * auVar88._28_4_);
                  auVar91 = vsubps_avx(ZEXT1632(auVar82),auVar96);
                  auVar80 = vfmadd213ps_fma(auVar91,local_3e0,auVar96);
                  uVar132 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar29._4_4_ = uVar132;
                  auVar29._0_4_ = uVar132;
                  auVar29._8_4_ = uVar132;
                  auVar29._12_4_ = uVar132;
                  auVar29._16_4_ = uVar132;
                  auVar29._20_4_ = uVar132;
                  auVar29._24_4_ = uVar132;
                  auVar29._28_4_ = uVar132;
                  auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                               CONCAT48(auVar80._8_4_ +
                                                                        auVar80._8_4_,
                                                                        CONCAT44(auVar80._4_4_ +
                                                                                 auVar80._4_4_,
                                                                                 auVar80._0_4_ +
                                                                                 auVar80._0_4_)))),
                                            auVar29);
                  uVar140 = vcmpps_avx512vl(local_3a0,auVar91,6);
                  if (((byte)uVar140 & bVar75) != 0) {
                    auVar142._0_4_ = auVar87._0_4_ * fVar146;
                    auVar142._4_4_ = auVar87._4_4_ * fVar131;
                    auVar142._8_4_ = auVar87._8_4_ * fVar138;
                    auVar142._12_4_ = auVar87._12_4_ * fVar139;
                    auVar142._16_4_ = auVar87._16_4_ * 0.0;
                    auVar142._20_4_ = auVar87._20_4_ * 0.0;
                    auVar142._24_4_ = auVar87._24_4_ * 0.0;
                    auVar142._28_4_ = 0;
                    auVar91 = vsubps_avx512vl(auVar90,auVar142);
                    auVar122._0_4_ =
                         (uint)(bVar68 & 1) * (int)auVar142._0_4_ |
                         (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
                    auVar122._4_4_ =
                         (uint)bVar14 * (int)auVar142._4_4_ | (uint)!bVar14 * auVar91._4_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
                    auVar122._8_4_ =
                         (uint)bVar14 * (int)auVar142._8_4_ | (uint)!bVar14 * auVar91._8_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
                    auVar122._12_4_ =
                         (uint)bVar14 * (int)auVar142._12_4_ | (uint)!bVar14 * auVar91._12_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 4) & 1);
                    auVar122._16_4_ =
                         (uint)bVar14 * (int)auVar142._16_4_ | (uint)!bVar14 * auVar91._16_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 5) & 1);
                    auVar122._20_4_ =
                         (uint)bVar14 * (int)auVar142._20_4_ | (uint)!bVar14 * auVar91._20_4_;
                    bVar14 = (bool)((byte)(uVar70 >> 6) & 1);
                    auVar122._24_4_ =
                         (uint)bVar14 * (int)auVar142._24_4_ | (uint)!bVar14 * auVar91._24_4_;
                    auVar122._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar91._28_4_;
                    auVar30._8_4_ = 0x40000000;
                    auVar30._0_8_ = 0x4000000040000000;
                    auVar30._12_4_ = 0x40000000;
                    auVar30._16_4_ = 0x40000000;
                    auVar30._20_4_ = 0x40000000;
                    auVar30._24_4_ = 0x40000000;
                    auVar30._28_4_ = 0x40000000;
                    local_3c0 = vfmsub132ps_avx512vl(auVar122,auVar90,auVar30);
                    local_380 = (undefined4)lVar74;
                    local_360 = local_650._0_8_;
                    uStack_358 = local_650._8_8_;
                    local_350 = local_660._0_8_;
                    uStack_348 = local_660._8_8_;
                    pGVar12 = (context->scene->geometries).items[uVar71].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar68 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar68 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar80 = vcvtsi2ss_avx512f(auVar183._0_16_,local_380);
                      fVar146 = auVar80._0_4_;
                      local_320[0] = (fVar146 + local_3e0._0_4_ + 0.0) * (float)local_480;
                      local_320[1] = (fVar146 + local_3e0._4_4_ + 1.0) * local_480._4_4_;
                      local_320[2] = (fVar146 + local_3e0._8_4_ + 2.0) * fStack_478;
                      local_320[3] = (fVar146 + local_3e0._12_4_ + 3.0) * fStack_474;
                      fStack_310 = (fVar146 + local_3e0._16_4_ + 4.0) * fStack_470;
                      fStack_30c = (fVar146 + local_3e0._20_4_ + 5.0) * fStack_46c;
                      fStack_308 = (fVar146 + local_3e0._24_4_ + 6.0) * fStack_468;
                      fStack_304 = fVar146 + local_3e0._28_4_ + 7.0;
                      local_300 = local_3c0;
                      local_2e0 = local_3a0;
                      uVar70 = CONCAT71(0,(byte)uVar140 & bVar75);
                      local_4e0._0_8_ = uVar70;
                      lVar25 = 0;
                      for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_4c0._0_8_ = lVar25;
                      local_520._0_4_ = (int)uVar69;
                      local_2c0 = auVar176;
                      local_37c = iVar11;
                      local_370 = auVar22;
                      do {
                        auVar79 = auVar187._0_16_;
                        local_220 = local_320[local_4c0._0_8_];
                        local_200 = *(undefined4 *)(local_300 + local_4c0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2e0 + local_4c0._0_8_ * 4);
                        local_6b0.context = context->user;
                        fVar131 = 1.0 - local_220;
                        fVar146 = fVar131 * fVar131 * -3.0;
                        auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                                  ZEXT416((uint)(local_220 * fVar131)),
                                                  ZEXT416(0xc0000000));
                        auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar131)),
                                                  ZEXT416((uint)(local_220 * local_220)),
                                                  ZEXT416(0x40000000));
                        fVar131 = auVar80._0_4_ * 3.0;
                        fVar138 = auVar82._0_4_ * 3.0;
                        fVar139 = local_220 * local_220 * 3.0;
                        auVar160._0_4_ = fVar139 * (float)local_490._0_4_;
                        auVar160._4_4_ = fVar139 * (float)local_490._4_4_;
                        auVar160._8_4_ = fVar139 * fStack_488;
                        auVar160._12_4_ = fVar139 * fStack_484;
                        auVar135._4_4_ = fVar138;
                        auVar135._0_4_ = fVar138;
                        auVar135._8_4_ = fVar138;
                        auVar135._12_4_ = fVar138;
                        auVar80 = vfmadd132ps_fma(auVar135,auVar160,local_660);
                        auVar150._4_4_ = fVar131;
                        auVar150._0_4_ = fVar131;
                        auVar150._8_4_ = fVar131;
                        auVar150._12_4_ = fVar131;
                        auVar80 = vfmadd132ps_fma(auVar150,auVar80,local_650);
                        auVar136._4_4_ = fVar146;
                        auVar136._0_4_ = fVar146;
                        auVar136._8_4_ = fVar146;
                        auVar136._12_4_ = fVar146;
                        auVar80 = vfmadd213ps_fma(auVar136,auVar22,auVar80);
                        local_280 = auVar80._0_4_;
                        auVar158._8_4_ = 1;
                        auVar158._0_8_ = 0x100000001;
                        auVar158._12_4_ = 1;
                        auVar158._16_4_ = 1;
                        auVar158._20_4_ = 1;
                        auVar158._24_4_ = 1;
                        auVar158._28_4_ = 1;
                        local_260 = vpermps_avx2(auVar158,ZEXT1632(auVar80));
                        auVar162._8_4_ = 2;
                        auVar162._0_8_ = 0x200000002;
                        auVar162._12_4_ = 2;
                        auVar162._16_4_ = 2;
                        auVar162._20_4_ = 2;
                        auVar162._24_4_ = 2;
                        auVar162._28_4_ = 2;
                        local_240 = vpermps_avx2(auVar162,ZEXT1632(auVar80));
                        uStack_27c = local_280;
                        uStack_278 = local_280;
                        uStack_274 = local_280;
                        uStack_270 = local_280;
                        uStack_26c = local_280;
                        uStack_268 = local_280;
                        uStack_264 = local_280;
                        fStack_21c = local_220;
                        fStack_218 = local_220;
                        fStack_214 = local_220;
                        fStack_210 = local_220;
                        fStack_20c = local_220;
                        fStack_208 = local_220;
                        fStack_204 = local_220;
                        uStack_1fc = local_200;
                        uStack_1f8 = local_200;
                        uStack_1f4 = local_200;
                        uStack_1f0 = local_200;
                        uStack_1ec = local_200;
                        uStack_1e8 = local_200;
                        uStack_1e4 = local_200;
                        local_1e0 = local_440._0_8_;
                        uStack_1d8 = local_440._8_8_;
                        uStack_1d0 = local_440._16_8_;
                        uStack_1c8 = local_440._24_8_;
                        local_1c0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_1a0 = (local_6b0.context)->instID[0];
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = (local_6b0.context)->instPrimID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_5c0 = local_2a0;
                        local_6b0.valid = (int *)local_5c0;
                        local_6b0.geometryUserPtr = pGVar12->userPtr;
                        local_6b0.hit = (RTCHitN *)&local_280;
                        local_6b0.N = 8;
                        local_6b0.ray = (RTCRayN *)ray;
                        if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar12->occlusionFilterN)(&local_6b0);
                          auVar178 = ZEXT3264(local_2c0);
                          uVar69 = (ulong)(uint)local_520._0_4_;
                          auVar182 = ZEXT3264(local_680);
                          auVar177 = ZEXT3264(local_580);
                          auVar186 = ZEXT3264(local_560);
                          auVar185 = ZEXT3264(local_540);
                          auVar184 = ZEXT3264(local_500);
                          auVar80 = vxorps_avx512vl(auVar79,auVar79);
                          auVar187 = ZEXT1664(auVar80);
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar91);
                        }
                        auVar80 = auVar187._0_16_;
                        if (local_5c0 == (undefined1  [32])0x0) {
                          auVar188 = ZEXT3264(local_640);
                          auVar190 = ZEXT3264(local_600);
                          auVar191 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var13)(&local_6b0);
                            auVar178 = ZEXT3264(local_2c0);
                            uVar69 = (ulong)(uint)local_520._0_4_;
                            auVar182 = ZEXT3264(local_680);
                            auVar177 = ZEXT3264(local_580);
                            auVar186 = ZEXT3264(local_560);
                            auVar185 = ZEXT3264(local_540);
                            auVar184 = ZEXT3264(local_500);
                            auVar80 = vxorps_avx512vl(auVar80,auVar80);
                            auVar187 = ZEXT1664(auVar80);
                            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar189 = ZEXT3264(auVar91);
                          }
                          uVar70 = vptestmd_avx512vl(local_5c0,local_5c0);
                          auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar14 = (bool)((byte)uVar70 & 1);
                          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
                          bVar17 = (bool)((byte)(uVar70 >> 3) & 1);
                          bVar18 = (bool)((byte)(uVar70 >> 4) & 1);
                          bVar19 = (bool)((byte)(uVar70 >> 5) & 1);
                          bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                          bVar21 = SUB81(uVar70 >> 7,0);
                          *(uint *)(local_6b0.ray + 0x100) =
                               (uint)bVar14 * auVar91._0_4_ |
                               (uint)!bVar14 * *(int *)(local_6b0.ray + 0x100);
                          *(uint *)(local_6b0.ray + 0x104) =
                               (uint)bVar15 * auVar91._4_4_ |
                               (uint)!bVar15 * *(int *)(local_6b0.ray + 0x104);
                          *(uint *)(local_6b0.ray + 0x108) =
                               (uint)bVar16 * auVar91._8_4_ |
                               (uint)!bVar16 * *(int *)(local_6b0.ray + 0x108);
                          *(uint *)(local_6b0.ray + 0x10c) =
                               (uint)bVar17 * auVar91._12_4_ |
                               (uint)!bVar17 * *(int *)(local_6b0.ray + 0x10c);
                          *(uint *)(local_6b0.ray + 0x110) =
                               (uint)bVar18 * auVar91._16_4_ |
                               (uint)!bVar18 * *(int *)(local_6b0.ray + 0x110);
                          *(uint *)(local_6b0.ray + 0x114) =
                               (uint)bVar19 * auVar91._20_4_ |
                               (uint)!bVar19 * *(int *)(local_6b0.ray + 0x114);
                          *(uint *)(local_6b0.ray + 0x118) =
                               (uint)bVar20 * auVar91._24_4_ |
                               (uint)!bVar20 * *(int *)(local_6b0.ray + 0x118);
                          *(uint *)(local_6b0.ray + 0x11c) =
                               (uint)bVar21 * auVar91._28_4_ |
                               (uint)!bVar21 * *(int *)(local_6b0.ray + 0x11c);
                          auVar188 = ZEXT3264(local_640);
                          auVar190 = ZEXT3264(local_600);
                          auVar191 = ZEXT3264(local_620);
                          if (local_5c0 != (undefined1  [32])0x0) {
                            bVar68 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar178._0_4_;
                        local_4e0._0_8_ = local_4e0._0_8_ ^ 1L << (local_4c0._0_8_ & 0x3f);
                        bVar68 = 0;
                        lVar25 = 0;
                        for (uVar70 = local_4e0._0_8_; (uVar70 & 1) == 0;
                            uVar70 = uVar70 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        local_4c0._0_8_ = lVar25;
                      } while (local_4e0._0_8_ != 0);
                    }
                    uVar69 = CONCAT71((int7)(uVar69 >> 8),(byte)uVar69 | bVar68);
                  }
                }
                goto LAB_01c8a733;
              }
            }
            auVar182 = ZEXT3264(local_680);
          }
LAB_01c8a733:
          lVar74 = lVar74 + 8;
          auVar183 = auVar177;
        } while ((int)lVar74 < iVar11);
      }
      bVar75 = (byte)uVar69;
      if ((uVar69 & 1) != 0) break;
      uVar132 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar28._4_4_ = uVar132;
      auVar28._0_4_ = uVar132;
      auVar28._8_4_ = uVar132;
      auVar28._12_4_ = uVar132;
      auVar28._16_4_ = uVar132;
      auVar28._20_4_ = uVar132;
      auVar28._24_4_ = uVar132;
      auVar28._28_4_ = uVar132;
      uVar140 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar71 = (uint)uVar72 & (uint)uVar140;
      uVar72 = (ulong)uVar71;
    } while (uVar71 != 0);
  }
  return (bool)(bVar75 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }